

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  _func_int *p_Var9;
  void *pvVar10;
  size_t sVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int *piVar27;
  void *pvVar28;
  int iVar29;
  uint uVar30;
  float *pfVar31;
  int iVar32;
  int iVar33;
  uint *puVar34;
  int iVar35;
  undefined4 *puVar36;
  uint _w;
  undefined4 *puVar37;
  float *pfVar38;
  uint *puVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [32];
  undefined1 (*pauVar42) [32];
  undefined1 (*pauVar43) [16];
  float *pfVar44;
  ulong uVar45;
  uint *puVar46;
  ulong uVar47;
  undefined1 (*pauVar48) [32];
  float *pfVar49;
  int iVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  undefined1 (*pauVar54) [32];
  undefined1 (*pauVar55) [16];
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [28];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar238;
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar240 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [64];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [64];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [64];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar461 [16];
  float fVar487;
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  float fVar486;
  undefined1 auVar484 [64];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar485 [64];
  ulong local_110;
  ulong local_100;
  Mat local_a8;
  void *local_58;
  long local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  undefined1 auVar137 [32];
  undefined1 auVar143 [32];
  undefined1 auVar150 [32];
  undefined1 auVar222 [32];
  undefined1 auVar233 [32];
  undefined1 auVar266 [32];
  
  uVar47 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  p_Var6 = this->_vptr_Convolution1D_x86_fma[-3];
  iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var6);
  iVar35 = *(int *)(&this->field_0xd8 + (long)p_Var6);
  local_a8.cstep = 0;
  local_a8.data = (Allocator *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_a8.elempack = 0;
  local_a8.h = 0;
  local_a8.allocator = (Allocator *)local_a8.data;
  local_a8.dims = (int)local_a8.refcount;
  local_a8.w = local_a8.refcount._4_4_;
  local_a8.d = (int)local_a8.refcount;
  local_a8.c = local_a8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_fma + (long)p_Var6),bottom_blob,
             &local_a8,opt);
  iVar29 = local_a8.h;
  iVar50 = -100;
  if (((Allocator *)local_a8.data != (Allocator *)0x0) && ((long)local_a8.c * local_a8.cstep != 0))
  {
    uVar30 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]);
    lVar51 = 1;
    if (opt->use_packing_layout == true) {
      lVar51 = 8;
      if ((uVar30 & 7) != 0) {
        lVar51 = (ulong)((uVar30 & 3) == 0) * 3 + 1;
      }
    }
    uVar52 = (ulong)(uint)local_a8.h;
    iVar33 = (int)lVar51;
    iVar5 = (local_a8.w + ~((iVar5 + -1) * iVar35)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_fma[-3]);
    _w = iVar5 + 1;
    uVar30 = (int)uVar30 / iVar33;
    Mat::create(top_blob,_w,uVar30,lVar51 * (uVar47 / (ulong)(long)iVar4),iVar33,opt->blob_allocator
               );
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar56 = iVar33 == 8;
      bVar58 = 0 < (int)uVar30;
      if (iVar4 == 8 && (bVar58 && bVar56)) {
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        local_110 = 0;
        auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar375 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar319 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar146._8_4_ = 0x3f318000;
        auVar146._0_8_ = 0x3f3180003f318000;
        auVar146._12_4_ = 0x3f318000;
        auVar146._16_4_ = 0x3f318000;
        auVar146._20_4_ = 0x3f318000;
        auVar146._24_4_ = 0x3f318000;
        auVar146._28_4_ = 0x3f318000;
        do {
          if (-1 < iVar5) {
            pauVar41 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar35 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar484 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar484 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                     local_110 * 0x20));
              }
              if (iVar29 < 1) {
                auVar153 = ZEXT3264(auVar484._0_32_);
              }
              else {
                pauVar54 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_110 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var9 = pp_Var8[-3];
                puVar37 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar50) * 4 + 4);
                uVar47 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var9) < 1) {
                    auVar153 = ZEXT3264(auVar484._0_32_);
                  }
                  else {
                    puVar36 = puVar37;
                    iVar32 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      uVar1 = puVar36[-7];
                      auVar140._4_4_ = uVar1;
                      auVar140._0_4_ = uVar1;
                      auVar140._8_4_ = uVar1;
                      auVar140._12_4_ = uVar1;
                      auVar140._16_4_ = uVar1;
                      auVar140._20_4_ = uVar1;
                      auVar140._24_4_ = uVar1;
                      auVar140._28_4_ = uVar1;
                      uVar1 = puVar36[-6];
                      auVar142._4_4_ = uVar1;
                      auVar142._0_4_ = uVar1;
                      auVar142._8_4_ = uVar1;
                      auVar142._12_4_ = uVar1;
                      auVar142._16_4_ = uVar1;
                      auVar142._20_4_ = uVar1;
                      auVar142._24_4_ = uVar1;
                      auVar142._28_4_ = uVar1;
                      uVar1 = puVar36[-5];
                      auVar136._4_4_ = uVar1;
                      auVar136._0_4_ = uVar1;
                      auVar136._8_4_ = uVar1;
                      auVar136._12_4_ = uVar1;
                      auVar136._16_4_ = uVar1;
                      auVar136._20_4_ = uVar1;
                      auVar136._24_4_ = uVar1;
                      auVar136._28_4_ = uVar1;
                      uVar1 = puVar36[-4];
                      auVar149._4_4_ = uVar1;
                      auVar149._0_4_ = uVar1;
                      auVar149._8_4_ = uVar1;
                      auVar149._12_4_ = uVar1;
                      auVar149._16_4_ = uVar1;
                      auVar149._20_4_ = uVar1;
                      auVar149._24_4_ = uVar1;
                      auVar149._28_4_ = uVar1;
                      uVar1 = puVar36[-3];
                      auVar218._4_4_ = uVar1;
                      auVar218._0_4_ = uVar1;
                      auVar218._8_4_ = uVar1;
                      auVar218._12_4_ = uVar1;
                      auVar218._16_4_ = uVar1;
                      auVar218._20_4_ = uVar1;
                      auVar218._24_4_ = uVar1;
                      auVar218._28_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar228._4_4_ = uVar1;
                      auVar228._0_4_ = uVar1;
                      auVar228._8_4_ = uVar1;
                      auVar228._12_4_ = uVar1;
                      auVar228._16_4_ = uVar1;
                      auVar228._20_4_ = uVar1;
                      auVar228._24_4_ = uVar1;
                      auVar228._28_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar446._4_4_ = uVar1;
                      auVar446._0_4_ = uVar1;
                      auVar446._8_4_ = uVar1;
                      auVar446._12_4_ = uVar1;
                      auVar446._16_4_ = uVar1;
                      auVar446._20_4_ = uVar1;
                      auVar446._24_4_ = uVar1;
                      auVar446._28_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar453._4_4_ = uVar1;
                      auVar453._0_4_ = uVar1;
                      auVar453._8_4_ = uVar1;
                      auVar453._12_4_ = uVar1;
                      auVar453._16_4_ = uVar1;
                      auVar453._20_4_ = uVar1;
                      auVar453._24_4_ = uVar1;
                      auVar453._28_4_ = uVar1;
                      auVar239 = vfmadd132ps_fma(auVar140,auVar484._0_32_,*pauVar54);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar142,pauVar54[1]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar136,pauVar54[2]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar149,pauVar54[3]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar218,pauVar54[4]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar228,pauVar54[5]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar446,pauVar54[6]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar453,pauVar54[7]);
                      auVar153 = ZEXT1664(auVar239);
                      pauVar54 = pauVar54 + 8;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 3);
                      auVar484 = ZEXT1664(auVar239);
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                  uVar47 = uVar47 + 1;
                  puVar37 = (undefined4 *)((long)puVar37 + (long)local_a8.w * local_a8.elemsize);
                  auVar484 = ZEXT3264(auVar153._0_32_);
                } while (uVar47 != uVar52);
              }
              auVar140 = auVar153._0_32_;
              auVar136 = auVar327._0_32_;
              auVar142 = auVar319._0_32_;
              auVar149 = auVar375._0_32_;
              auVar484._28_36_ = auVar153._28_36_;
              fVar62 = auVar319._0_4_;
              fVar61 = auVar319._4_4_;
              fVar2 = auVar319._8_4_;
              fVar3 = auVar319._12_4_;
              fVar238 = auVar319._16_4_;
              fVar486 = auVar319._20_4_;
              fVar487 = auVar319._24_4_;
              fVar12 = auVar319._28_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar140 = vmaxps_avx(auVar140,auVar136);
                break;
              case 2:
                auVar142 = vmaxps_avx(auVar140,auVar136);
                auVar140 = vminps_avx(auVar140,auVar136);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar139._4_4_ = uVar1;
                auVar139._0_4_ = uVar1;
                auVar139._8_4_ = uVar1;
                auVar139._12_4_ = uVar1;
                auVar139._16_4_ = uVar1;
                auVar139._20_4_ = uVar1;
                auVar139._24_4_ = uVar1;
                auVar139._28_4_ = uVar1;
                auVar239 = vfmadd213ps_fma(auVar139,auVar140,auVar142);
                auVar140 = ZEXT1632(auVar239);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar211._4_4_ = uVar1;
                auVar211._0_4_ = uVar1;
                auVar211._8_4_ = uVar1;
                auVar211._12_4_ = uVar1;
                auVar211._16_4_ = uVar1;
                auVar211._20_4_ = uVar1;
                auVar211._24_4_ = uVar1;
                auVar211._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar478._4_4_ = uVar1;
                auVar478._0_4_ = uVar1;
                auVar478._8_4_ = uVar1;
                auVar478._12_4_ = uVar1;
                auVar478._16_4_ = uVar1;
                auVar478._20_4_ = uVar1;
                auVar478._24_4_ = uVar1;
                auVar478._28_4_ = uVar1;
                auVar140 = vmaxps_avx(auVar140,auVar211);
                auVar140 = vminps_avx(auVar478,auVar140);
                break;
              case 4:
                auVar135._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
                auVar135._8_4_ = -auVar153._8_4_;
                auVar135._12_4_ = -auVar153._12_4_;
                auVar135._16_4_ = -auVar153._16_4_;
                auVar135._20_4_ = -auVar153._20_4_;
                auVar135._24_4_ = -auVar153._24_4_;
                auVar135._28_4_ = auVar153._28_4_ ^ 0x80000000;
                auVar212._8_4_ = 0x42b0c0a5;
                auVar212._0_8_ = 0x42b0c0a542b0c0a5;
                auVar212._12_4_ = 0x42b0c0a5;
                auVar212._16_4_ = 0x42b0c0a5;
                auVar212._20_4_ = 0x42b0c0a5;
                auVar212._24_4_ = 0x42b0c0a5;
                auVar212._28_4_ = 0x42b0c0a5;
                auVar140 = vminps_avx(auVar135,auVar212);
                auVar213._8_4_ = 0xc2b0c0a5;
                auVar213._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar213._12_4_ = 0xc2b0c0a5;
                auVar213._16_4_ = 0xc2b0c0a5;
                auVar213._20_4_ = 0xc2b0c0a5;
                auVar213._24_4_ = 0xc2b0c0a5;
                auVar213._28_4_ = 0xc2b0c0a5;
                auVar136 = vmaxps_avx(auVar140,auVar213);
                auVar214._8_4_ = 0x3fb8aa3b;
                auVar214._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar214._12_4_ = 0x3fb8aa3b;
                auVar214._16_4_ = 0x3fb8aa3b;
                auVar214._20_4_ = 0x3fb8aa3b;
                auVar214._24_4_ = 0x3fb8aa3b;
                auVar214._28_4_ = 0x3fb8aa3b;
                auVar239 = vfmadd213ps_fma(auVar214,auVar136,auVar149);
                auVar218 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar140 = vcmpps_avx(ZEXT1632(auVar239),auVar218,1);
                auVar140 = vandps_avx(auVar140,auVar142);
                auVar140 = vsubps_avx(auVar218,auVar140);
                auVar84._8_4_ = 0x3f318000;
                auVar84._0_8_ = 0x3f3180003f318000;
                auVar84._12_4_ = 0x3f318000;
                auVar84._16_4_ = 0x3f318000;
                auVar84._20_4_ = 0x3f318000;
                auVar84._24_4_ = 0x3f318000;
                auVar84._28_4_ = 0x3f318000;
                auVar239 = vfmsub231ps_fma(auVar136,auVar140,auVar84);
                auVar253._8_4_ = 0x395e8083;
                auVar253._0_8_ = 0x395e8083395e8083;
                auVar253._12_4_ = 0x395e8083;
                auVar253._16_4_ = 0x395e8083;
                auVar253._20_4_ = 0x395e8083;
                auVar253._24_4_ = 0x395e8083;
                auVar253._28_4_ = 0x395e8083;
                auVar407 = vfmsub231ps_fma(ZEXT1632(auVar239),auVar140,auVar253);
                auVar136 = ZEXT1632(auVar407);
                auVar16._28_4_ = auVar218._28_4_;
                auVar16._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar421._8_4_ = 0x39506967;
                auVar421._0_8_ = 0x3950696739506967;
                auVar421._12_4_ = 0x39506967;
                auVar421._16_4_ = 0x39506967;
                auVar421._20_4_ = 0x39506967;
                auVar421._24_4_ = 0x39506967;
                auVar421._28_4_ = 0x39506967;
                auVar254._8_4_ = 0x3ab743ce;
                auVar254._0_8_ = 0x3ab743ce3ab743ce;
                auVar254._12_4_ = 0x3ab743ce;
                auVar254._16_4_ = 0x3ab743ce;
                auVar254._20_4_ = 0x3ab743ce;
                auVar254._24_4_ = 0x3ab743ce;
                auVar254._28_4_ = 0x3ab743ce;
                auVar239 = vfmadd213ps_fma(auVar421,auVar136,auVar254);
                auVar85._8_4_ = 0x3c088908;
                auVar85._0_8_ = 0x3c0889083c088908;
                auVar85._12_4_ = 0x3c088908;
                auVar85._16_4_ = 0x3c088908;
                auVar85._20_4_ = 0x3c088908;
                auVar85._24_4_ = 0x3c088908;
                auVar85._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar85);
                auVar86._8_4_ = 0x3d2aa9c1;
                auVar86._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar86._12_4_ = 0x3d2aa9c1;
                auVar86._16_4_ = 0x3d2aa9c1;
                auVar86._20_4_ = 0x3d2aa9c1;
                auVar86._24_4_ = 0x3d2aa9c1;
                auVar86._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar86);
                auVar87._8_4_ = 0x3e2aaaaa;
                auVar87._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar87._12_4_ = 0x3e2aaaaa;
                auVar87._16_4_ = 0x3e2aaaaa;
                auVar87._20_4_ = 0x3e2aaaaa;
                auVar87._24_4_ = 0x3e2aaaaa;
                auVar87._28_4_ = 0x3e2aaaaa;
                auVar136 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar87);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar149);
                auVar332 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar16,auVar136);
                auVar106._0_4_ = (int)auVar140._0_4_;
                auVar106._4_4_ = (int)auVar140._4_4_;
                auVar106._8_4_ = (int)auVar140._8_4_;
                auVar106._12_4_ = (int)auVar140._12_4_;
                auVar137._16_4_ = (int)auVar140._16_4_;
                auVar137._0_16_ = auVar106;
                auVar137._20_4_ = (int)auVar140._20_4_;
                auVar137._24_4_ = (int)auVar140._24_4_;
                auVar137._28_4_ = (int)auVar140._28_4_;
                auVar407 = vpslld_avx(auVar106,0x17);
                auVar239 = vpslld_avx(auVar137._16_16_,0x17);
                auVar63._8_4_ = 0x3f800000;
                auVar63._0_8_ = 0x3f8000003f800000;
                auVar63._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar239,auVar63);
                auVar407 = vpaddd_avx(auVar407,auVar63);
                auVar138._16_16_ = auVar239;
                auVar138._0_16_ = auVar407;
                auVar215._0_4_ = auVar332._0_4_ + fVar62;
                auVar215._4_4_ = auVar332._4_4_ + fVar61;
                auVar215._8_4_ = auVar332._8_4_ + fVar2;
                auVar215._12_4_ = auVar332._12_4_ + fVar3;
                auVar215._16_4_ = fVar238 + 0.0;
                auVar215._20_4_ = fVar486 + 0.0;
                auVar215._24_4_ = fVar487 + 0.0;
                auVar215._28_4_ = fVar12 + 0.0;
                auVar239 = vfmadd213ps_fma(auVar138,auVar215,auVar142);
                auVar140 = vrcpps_avx(ZEXT1632(auVar239));
                auVar239 = vfmsub213ps_fma(ZEXT1632(auVar239),auVar140,auVar142);
                auVar239 = vfnmadd132ps_fma(ZEXT1632(auVar239),auVar140,auVar140);
                auVar140 = ZEXT1632(auVar239);
                break;
              case 5:
                auVar447._8_4_ = 0x42b0c0a5;
                auVar447._0_8_ = 0x42b0c0a542b0c0a5;
                auVar447._12_4_ = 0x42b0c0a5;
                auVar447._16_4_ = 0x42b0c0a5;
                auVar447._20_4_ = 0x42b0c0a5;
                auVar447._24_4_ = 0x42b0c0a5;
                auVar447._28_4_ = 0x42b0c0a5;
                auVar140 = vminps_avx(auVar447,auVar140);
                auVar454._8_4_ = 0xc2b0c0a5;
                auVar454._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar454._12_4_ = 0xc2b0c0a5;
                auVar454._16_4_ = 0xc2b0c0a5;
                auVar454._20_4_ = 0xc2b0c0a5;
                auVar454._24_4_ = 0xc2b0c0a5;
                auVar454._28_4_ = 0xc2b0c0a5;
                auVar136 = vmaxps_avx(auVar454,auVar140);
                auVar418._8_4_ = 0x3fb8aa3b;
                auVar418._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar418._12_4_ = 0x3fb8aa3b;
                auVar418._16_4_ = 0x3fb8aa3b;
                auVar418._20_4_ = 0x3fb8aa3b;
                auVar418._24_4_ = 0x3fb8aa3b;
                auVar418._28_4_ = 0x3fb8aa3b;
                auVar239 = vfmadd213ps_fma(auVar418,auVar136,auVar149);
                auVar218 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar140 = vcmpps_avx(ZEXT1632(auVar239),auVar218,1);
                auVar140 = vandps_avx(auVar140,auVar142);
                auVar140 = vsubps_avx(auVar218,auVar140);
                auVar239 = vfmsub231ps_fma(auVar136,auVar140,auVar146);
                auVar455._8_4_ = 0xb95e8083;
                auVar455._0_8_ = 0xb95e8083b95e8083;
                auVar455._12_4_ = 0xb95e8083;
                auVar455._16_4_ = 0xb95e8083;
                auVar455._20_4_ = 0xb95e8083;
                auVar455._24_4_ = 0xb95e8083;
                auVar455._28_4_ = 0xb95e8083;
                auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar239),auVar140,auVar455);
                auVar136 = ZEXT1632(auVar407);
                auVar13._28_4_ = auVar218._28_4_;
                auVar13._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar324._8_4_ = 0x39506967;
                auVar324._0_8_ = 0x3950696739506967;
                auVar324._12_4_ = 0x39506967;
                auVar324._16_4_ = 0x39506967;
                auVar324._20_4_ = 0x39506967;
                auVar324._24_4_ = 0x39506967;
                auVar324._28_4_ = 0x39506967;
                auVar459._8_4_ = 0x3ab743ce;
                auVar459._0_8_ = 0x3ab743ce3ab743ce;
                auVar459._12_4_ = 0x3ab743ce;
                auVar459._16_4_ = 0x3ab743ce;
                auVar459._20_4_ = 0x3ab743ce;
                auVar459._24_4_ = 0x3ab743ce;
                auVar459._28_4_ = 0x3ab743ce;
                auVar239 = vfmadd213ps_fma(auVar324,auVar136,auVar459);
                auVar300._8_4_ = 0x3c088908;
                auVar300._0_8_ = 0x3c0889083c088908;
                auVar300._12_4_ = 0x3c088908;
                auVar300._16_4_ = 0x3c088908;
                auVar300._20_4_ = 0x3c088908;
                auVar300._24_4_ = 0x3c088908;
                auVar300._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar300);
                auVar460._8_4_ = 0x3d2aa9c1;
                auVar460._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar460._12_4_ = 0x3d2aa9c1;
                auVar460._16_4_ = 0x3d2aa9c1;
                auVar460._20_4_ = 0x3d2aa9c1;
                auVar460._24_4_ = 0x3d2aa9c1;
                auVar460._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar460);
                auVar448._8_4_ = 0x3e2aaaaa;
                auVar448._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar448._12_4_ = 0x3e2aaaaa;
                auVar448._16_4_ = 0x3e2aaaaa;
                auVar448._20_4_ = 0x3e2aaaaa;
                auVar448._24_4_ = 0x3e2aaaaa;
                auVar448._28_4_ = 0x3e2aaaaa;
                auVar136 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar448);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar149);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar13,auVar136);
                auVar205._0_4_ = auVar239._0_4_ + fVar62;
                auVar205._4_4_ = auVar239._4_4_ + fVar61;
                auVar205._8_4_ = auVar239._8_4_ + fVar2;
                auVar205._12_4_ = auVar239._12_4_ + fVar3;
                auVar205._16_4_ = fVar238 + 0.0;
                auVar205._20_4_ = fVar486 + 0.0;
                auVar205._24_4_ = fVar487 + 0.0;
                auVar205._28_4_ = fVar12 + 0.0;
                auVar407._0_4_ = (int)auVar140._0_4_;
                auVar407._4_4_ = (int)auVar140._4_4_;
                auVar407._8_4_ = (int)auVar140._8_4_;
                auVar407._12_4_ = (int)auVar140._12_4_;
                auVar246._16_4_ = (int)auVar140._16_4_;
                auVar246._0_16_ = auVar407;
                auVar246._20_4_ = (int)auVar140._20_4_;
                auVar246._24_4_ = (int)auVar140._24_4_;
                auVar246._28_4_ = (int)auVar140._28_4_;
                auVar407 = vpslld_avx(auVar407,0x17);
                auVar239 = vpslld_avx(auVar246._16_16_,0x17);
                auVar415._8_4_ = 0x3f800000;
                auVar415._0_8_ = 0x3f8000003f800000;
                auVar415._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar239,auVar415);
                auVar407 = vpaddd_avx(auVar407,auVar415);
                auVar477._16_16_ = auVar239;
                auVar477._0_16_ = auVar407;
                auVar332 = vfmadd213ps_fma(auVar477,auVar205,auVar142);
                auVar206._8_4_ = 0x800000;
                auVar206._0_8_ = 0x80000000800000;
                auVar206._12_4_ = 0x800000;
                auVar206._16_4_ = 0x800000;
                auVar206._20_4_ = 0x800000;
                auVar206._24_4_ = 0x800000;
                auVar206._28_4_ = 0x800000;
                auVar140 = vmaxps_avx(ZEXT1632(auVar332),auVar206);
                auVar407 = vpsrld_avx(auVar140._0_16_,0x17);
                auVar239 = vpsrld_avx(auVar140._16_16_,0x17);
                auVar311._8_4_ = 0x807fffff;
                auVar311._0_8_ = 0x807fffff807fffff;
                auVar311._12_4_ = 0x807fffff;
                auVar311._16_4_ = 0x807fffff;
                auVar311._20_4_ = 0x807fffff;
                auVar311._24_4_ = 0x807fffff;
                auVar311._28_4_ = 0x807fffff;
                auVar140 = vandps_avx(auVar140,auVar311);
                auVar218 = vorps_avx(auVar149,auVar140);
                auVar312._8_4_ = 0x3f3504f3;
                auVar312._0_8_ = 0x3f3504f33f3504f3;
                auVar312._12_4_ = 0x3f3504f3;
                auVar312._16_4_ = 0x3f3504f3;
                auVar312._20_4_ = 0x3f3504f3;
                auVar312._24_4_ = 0x3f3504f3;
                auVar312._28_4_ = 0x3f3504f3;
                auVar136 = vcmpps_avx(auVar312,auVar218,2);
                auVar140 = vandnps_avx(auVar136,auVar218);
                auVar449._8_4_ = 0xbf800000;
                auVar449._0_8_ = 0xbf800000bf800000;
                auVar449._12_4_ = 0xbf800000;
                auVar449._16_4_ = 0xbf800000;
                auVar449._20_4_ = 0xbf800000;
                auVar449._24_4_ = 0xbf800000;
                auVar449._28_4_ = 0xbf800000;
                auVar207._0_4_ = auVar140._0_4_ + auVar218._0_4_ + -1.0;
                auVar207._4_4_ = auVar140._4_4_ + auVar218._4_4_ + -1.0;
                auVar207._8_4_ = auVar140._8_4_ + auVar218._8_4_ + -1.0;
                auVar207._12_4_ = auVar140._12_4_ + auVar218._12_4_ + -1.0;
                auVar207._16_4_ = auVar140._16_4_ + auVar218._16_4_ + -1.0;
                auVar207._20_4_ = auVar140._20_4_ + auVar218._20_4_ + -1.0;
                auVar207._24_4_ = auVar140._24_4_ + auVar218._24_4_ + -1.0;
                auVar207._28_4_ = auVar140._28_4_ + auVar218._28_4_ + -1.0;
                auVar239 = vpsubd_avx(auVar239,auVar136._16_16_);
                auVar328._8_4_ = 0xffffff81;
                auVar328._0_8_ = 0xffffff81ffffff81;
                auVar328._12_4_ = 0xffffff81;
                auVar239 = vpaddd_avx(auVar239,auVar328);
                auVar407 = vpsubd_avx(auVar407,auVar136._0_16_);
                auVar407 = vpaddd_avx(auVar328,auVar407);
                auVar247._16_16_ = auVar239;
                auVar247._0_16_ = auVar407;
                auVar14._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                auVar14._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                auVar14._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                auVar14._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                auVar14._16_4_ = auVar207._16_4_ * auVar207._16_4_;
                auVar14._20_4_ = auVar207._20_4_ * auVar207._20_4_;
                auVar14._24_4_ = auVar207._24_4_ * auVar207._24_4_;
                auVar14._28_4_ = auVar136._28_4_;
                auVar419._8_4_ = 0x3d9021bb;
                auVar419._0_8_ = 0x3d9021bb3d9021bb;
                auVar419._12_4_ = 0x3d9021bb;
                auVar419._16_4_ = 0x3d9021bb;
                auVar419._20_4_ = 0x3d9021bb;
                auVar419._24_4_ = 0x3d9021bb;
                auVar419._28_4_ = 0x3d9021bb;
                auVar345._8_4_ = 0xbdebd1b8;
                auVar345._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar345._12_4_ = 0xbdebd1b8;
                auVar345._16_4_ = 0xbdebd1b8;
                auVar345._20_4_ = 0xbdebd1b8;
                auVar345._24_4_ = 0xbdebd1b8;
                auVar345._28_4_ = 0xbdebd1b8;
                auVar239 = vfmadd213ps_fma(auVar419,auVar207,auVar345);
                auVar346._8_4_ = 0x3def251a;
                auVar346._0_8_ = 0x3def251a3def251a;
                auVar346._12_4_ = 0x3def251a;
                auVar346._16_4_ = 0x3def251a;
                auVar346._20_4_ = 0x3def251a;
                auVar346._24_4_ = 0x3def251a;
                auVar346._28_4_ = 0x3def251a;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar207,auVar346);
                auVar347._8_4_ = 0xbdfe5d4f;
                auVar347._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar347._12_4_ = 0xbdfe5d4f;
                auVar347._16_4_ = 0xbdfe5d4f;
                auVar347._20_4_ = 0xbdfe5d4f;
                auVar347._24_4_ = 0xbdfe5d4f;
                auVar347._28_4_ = 0xbdfe5d4f;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar207,auVar347);
                auVar348._8_4_ = 0x3e11e9bf;
                auVar348._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar348._12_4_ = 0x3e11e9bf;
                auVar348._16_4_ = 0x3e11e9bf;
                auVar348._20_4_ = 0x3e11e9bf;
                auVar348._24_4_ = 0x3e11e9bf;
                auVar348._28_4_ = 0x3e11e9bf;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar207,auVar348);
                auVar349._8_4_ = 0xbe2aae50;
                auVar349._0_8_ = 0xbe2aae50be2aae50;
                auVar349._12_4_ = 0xbe2aae50;
                auVar349._16_4_ = 0xbe2aae50;
                auVar349._20_4_ = 0xbe2aae50;
                auVar349._24_4_ = 0xbe2aae50;
                auVar349._28_4_ = 0xbe2aae50;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar207,auVar349);
                auVar350._8_4_ = 0x3e4cceac;
                auVar350._0_8_ = 0x3e4cceac3e4cceac;
                auVar350._12_4_ = 0x3e4cceac;
                auVar350._16_4_ = 0x3e4cceac;
                auVar350._20_4_ = 0x3e4cceac;
                auVar350._24_4_ = 0x3e4cceac;
                auVar350._28_4_ = 0x3e4cceac;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar207,auVar350);
                auVar351._8_4_ = 0xbe7ffffc;
                auVar351._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar351._12_4_ = 0xbe7ffffc;
                auVar351._16_4_ = 0xbe7ffffc;
                auVar351._20_4_ = 0xbe7ffffc;
                auVar351._24_4_ = 0xbe7ffffc;
                auVar351._28_4_ = 0xbe7ffffc;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar207,auVar351);
                auVar352._8_4_ = 0x3eaaaaaa;
                auVar352._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar352._12_4_ = 0x3eaaaaaa;
                auVar352._16_4_ = 0x3eaaaaaa;
                auVar352._20_4_ = 0x3eaaaaaa;
                auVar352._24_4_ = 0x3eaaaaaa;
                auVar352._28_4_ = 0x3eaaaaaa;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar207,auVar352);
                auVar420._0_4_ = auVar207._0_4_ * auVar207._0_4_ * auVar207._0_4_ * auVar239._0_4_;
                auVar420._4_4_ = auVar207._4_4_ * auVar207._4_4_ * auVar207._4_4_ * auVar239._4_4_;
                auVar420._8_4_ = auVar207._8_4_ * auVar207._8_4_ * auVar207._8_4_ * auVar239._8_4_;
                auVar420._12_4_ =
                     auVar207._12_4_ * auVar207._12_4_ * auVar207._12_4_ * auVar239._12_4_;
                auVar420._16_4_ = auVar207._16_4_ * auVar207._16_4_ * auVar207._16_4_ * 0.0;
                auVar420._20_4_ = auVar207._20_4_ * auVar207._20_4_ * auVar207._20_4_ * 0.0;
                auVar420._24_4_ = auVar207._24_4_ * auVar207._24_4_ * auVar207._24_4_ * 0.0;
                auVar420._28_4_ = 0;
                auVar136 = vcvtdq2ps_avx(auVar247);
                auVar239 = vfmadd231ps_fma(auVar420,auVar136,auVar455);
                auVar239 = vfmsub231ps_fma(ZEXT1632(auVar239),auVar149,auVar14);
                auVar140 = vcmpps_avx(ZEXT1632(auVar332),_DAT_0051a220,2);
                auVar218 = vsubps_avx(ZEXT1632(auVar239),auVar207);
                auVar239 = vfmsub231ps_fma(auVar218,auVar146,auVar136);
                auVar435._8_4_ = 0xc0000000;
                auVar435._0_8_ = 0xc0000000c0000000;
                auVar435._12_4_ = 0xc0000000;
                auVar435._16_4_ = 0xc0000000;
                auVar435._20_4_ = 0xc0000000;
                auVar435._24_4_ = 0xc0000000;
                auVar435._28_4_ = 0xc0000000;
                auVar208._0_4_ = auVar239._0_4_ * -2.0;
                auVar208._4_4_ = auVar239._4_4_ * -2.0;
                auVar208._8_4_ = auVar239._8_4_ * -2.0;
                auVar208._12_4_ = auVar239._12_4_ * -2.0;
                auVar208._16_4_ = 0x80000000;
                auVar208._20_4_ = 0x80000000;
                auVar208._24_4_ = 0x80000000;
                auVar208._28_4_ = 0;
                auVar248._8_4_ = 0x7fffffff;
                auVar248._0_8_ = 0x7fffffff7fffffff;
                auVar248._12_4_ = 0x7fffffff;
                auVar248._16_4_ = 0x7fffffff;
                auVar248._20_4_ = 0x7fffffff;
                auVar248._24_4_ = 0x7fffffff;
                auVar248._28_4_ = 0x7fffffff;
                auVar140 = vblendvps_avx(auVar208,auVar248,auVar140);
                auVar249._8_4_ = 0x42b0c0a5;
                auVar249._0_8_ = 0x42b0c0a542b0c0a5;
                auVar249._12_4_ = 0x42b0c0a5;
                auVar249._16_4_ = 0x42b0c0a5;
                auVar249._20_4_ = 0x42b0c0a5;
                auVar249._24_4_ = 0x42b0c0a5;
                auVar249._28_4_ = 0x42b0c0a5;
                auVar140 = vminps_avx(auVar140,auVar249);
                auVar250._8_4_ = 0xc2b0c0a5;
                auVar250._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar250._12_4_ = 0xc2b0c0a5;
                auVar250._16_4_ = 0xc2b0c0a5;
                auVar250._20_4_ = 0xc2b0c0a5;
                auVar250._24_4_ = 0xc2b0c0a5;
                auVar250._28_4_ = 0xc2b0c0a5;
                auVar136 = vmaxps_avx(auVar140,auVar250);
                auVar251._8_4_ = 0x3fb8aa3b;
                auVar251._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar251._12_4_ = 0x3fb8aa3b;
                auVar251._16_4_ = 0x3fb8aa3b;
                auVar251._20_4_ = 0x3fb8aa3b;
                auVar251._24_4_ = 0x3fb8aa3b;
                auVar251._28_4_ = 0x3fb8aa3b;
                auVar239 = vfmadd213ps_fma(auVar251,auVar136,auVar149);
                auVar218 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar140 = vcmpps_avx(ZEXT1632(auVar239),auVar218,1);
                auVar140 = vandps_avx(auVar140,auVar142);
                auVar140 = vsubps_avx(auVar218,auVar140);
                auVar239 = vfmsub231ps_fma(auVar136,auVar140,auVar146);
                auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar239),auVar140,auVar455);
                auVar136 = ZEXT1632(auVar407);
                auVar15._28_4_ = auVar218._28_4_;
                auVar15._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar327 = ZEXT864(0) << 0x20;
                auVar353._8_4_ = 0x3ab743ce;
                auVar353._0_8_ = 0x3ab743ce3ab743ce;
                auVar353._12_4_ = 0x3ab743ce;
                auVar353._16_4_ = 0x3ab743ce;
                auVar353._20_4_ = 0x3ab743ce;
                auVar353._24_4_ = 0x3ab743ce;
                auVar353._28_4_ = 0x3ab743ce;
                auVar239 = vfmadd213ps_fma(auVar324,auVar136,auVar353);
                auVar354._8_4_ = 0x3c088908;
                auVar354._0_8_ = 0x3c0889083c088908;
                auVar354._12_4_ = 0x3c088908;
                auVar354._16_4_ = 0x3c088908;
                auVar354._20_4_ = 0x3c088908;
                auVar354._24_4_ = 0x3c088908;
                auVar354._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar354);
                auVar375 = ZEXT3264(auVar149);
                auVar319 = ZEXT3264(auVar142);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar460);
                auVar83._8_4_ = 0x3e2aaaaa;
                auVar83._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar83._12_4_ = 0x3e2aaaaa;
                auVar83._16_4_ = 0x3e2aaaaa;
                auVar83._20_4_ = 0x3e2aaaaa;
                auVar83._24_4_ = 0x3e2aaaaa;
                auVar83._28_4_ = 0x3e2aaaaa;
                auVar136 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar83);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar149);
                auVar332 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar15,auVar136);
                auVar239._0_4_ = (int)auVar140._0_4_;
                auVar239._4_4_ = (int)auVar140._4_4_;
                auVar239._8_4_ = (int)auVar140._8_4_;
                auVar239._12_4_ = (int)auVar140._12_4_;
                auVar209._16_4_ = (int)auVar140._16_4_;
                auVar209._0_16_ = auVar239;
                auVar209._20_4_ = (int)auVar140._20_4_;
                auVar209._24_4_ = (int)auVar140._24_4_;
                auVar209._28_4_ = (int)auVar140._28_4_;
                auVar407 = vpslld_avx(auVar239,0x17);
                auVar239 = vpslld_avx(auVar209._16_16_,0x17);
                auVar239 = vpaddd_avx(auVar239,auVar415);
                auVar407 = vpaddd_avx(auVar407,auVar415);
                auVar210._16_16_ = auVar239;
                auVar210._0_16_ = auVar407;
                auVar252._0_4_ = auVar332._0_4_ + fVar62;
                auVar252._4_4_ = auVar332._4_4_ + fVar61;
                auVar252._8_4_ = auVar332._8_4_ + fVar2;
                auVar252._12_4_ = auVar332._12_4_ + fVar3;
                auVar252._16_4_ = fVar238 + 0.0;
                auVar252._20_4_ = fVar486 + 0.0;
                auVar252._24_4_ = fVar487 + 0.0;
                auVar252._28_4_ = fVar12 + 0.0;
                auVar239 = vfmadd213ps_fma(auVar210,auVar252,auVar142);
                auVar140 = vrcpps_avx(ZEXT1632(auVar239));
                auVar239 = vfmsub213ps_fma(ZEXT1632(auVar239),auVar140,auVar142);
                auVar239 = vfnmadd132ps_fma(ZEXT1632(auVar239),auVar140,auVar140);
                auVar239 = vfnmadd213ps_fma(ZEXT1632(auVar239),auVar435,auVar449);
                auVar204 = ZEXT1628(auVar239);
                goto LAB_004f5dff;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar216._4_4_ = uVar1;
                auVar216._0_4_ = uVar1;
                auVar216._8_4_ = uVar1;
                auVar216._12_4_ = uVar1;
                auVar216._16_4_ = uVar1;
                auVar216._20_4_ = uVar1;
                auVar216._24_4_ = uVar1;
                auVar216._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar255._4_4_ = uVar1;
                auVar255._0_4_ = uVar1;
                auVar255._8_4_ = uVar1;
                auVar255._12_4_ = uVar1;
                auVar255._16_4_ = uVar1;
                auVar255._20_4_ = uVar1;
                auVar255._24_4_ = uVar1;
                auVar255._28_4_ = uVar1;
                auVar239 = vfmadd231ps_fma(auVar255,auVar140,auVar216);
                auVar140 = vmaxps_avx(ZEXT1632(auVar239),auVar136);
                auVar140 = vminps_avx(auVar140,auVar142);
                auVar204 = auVar140._0_28_;
LAB_004f5dff:
                auVar484._0_4_ = auVar204._0_4_ * auVar153._0_4_;
                auVar484._4_4_ = auVar204._4_4_ * auVar153._4_4_;
                auVar484._8_4_ = auVar204._8_4_ * auVar153._8_4_;
                auVar484._12_4_ = auVar204._12_4_ * auVar153._12_4_;
                auVar484._16_4_ = auVar204._16_4_ * auVar153._16_4_;
                auVar484._20_4_ = auVar204._20_4_ * auVar153._20_4_;
                auVar484._24_4_ = auVar204._24_4_ * auVar153._24_4_;
                auVar140 = auVar484._0_32_;
              }
              *pauVar41 = auVar140;
              pauVar41 = pauVar41 + 1;
              iVar50 = iVar50 + 8;
              bVar57 = iVar35 != iVar5;
              iVar35 = iVar35 + 1;
            } while (bVar57);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar30);
      }
      if (iVar4 == 1 && (bVar58 && bVar56)) {
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        uVar47 = 0;
        auVar375 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar318._8_4_ = 0x3f000000;
        auVar318._0_8_ = 0x3f0000003f000000;
        auVar318._12_4_ = 0x3f000000;
        auVar318._16_4_ = 0x3f000000;
        auVar318._20_4_ = 0x3f000000;
        auVar318._24_4_ = 0x3f000000;
        auVar318._28_4_ = 0x3f000000;
        auVar484 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar319 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar327 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        do {
          if (-1 < iVar5) {
            pauVar41 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar47 * top_blob->elemsize + (long)top_blob->data);
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar35 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar153 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar153 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var6) + uVar47 * 0x20))
                ;
              }
              if (0 < iVar29) {
                pauVar54 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * uVar47 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var9 = pp_Var8[-3];
                puVar37 = (undefined4 *)
                          ((long)(_func_int ***)local_a8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar35) * 4);
                uVar45 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var9)) {
                    puVar36 = puVar37;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      uVar1 = *puVar36;
                      auVar217._4_4_ = uVar1;
                      auVar217._0_4_ = uVar1;
                      auVar217._8_4_ = uVar1;
                      auVar217._12_4_ = uVar1;
                      auVar217._16_4_ = uVar1;
                      auVar217._20_4_ = uVar1;
                      auVar217._24_4_ = uVar1;
                      auVar217._28_4_ = uVar1;
                      auVar239 = vfmadd231ps_fma(auVar153._0_32_,auVar217,*pauVar54);
                      auVar153 = ZEXT1664(auVar239);
                      pauVar54 = pauVar54 + 1;
                      puVar36 = puVar36 + *(int *)(&this->field_0xd8 + (long)p_Var9);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  uVar45 = uVar45 + 1;
                  puVar37 = (undefined4 *)((long)puVar37 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar45 != uVar52);
              }
              auVar146 = auVar153._0_32_;
              auVar140 = auVar319._0_32_;
              auVar142 = auVar327._0_32_;
              auVar136 = auVar375._0_32_;
              auVar149 = auVar484._0_32_;
              fVar62 = auVar319._0_4_;
              fVar61 = auVar319._4_4_;
              fVar2 = auVar319._8_4_;
              fVar3 = auVar319._12_4_;
              fVar238 = auVar319._16_4_;
              fVar486 = auVar319._20_4_;
              fVar487 = auVar319._24_4_;
              fVar12 = auVar319._28_4_;
              auVar485._28_36_ = auVar153._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar146 = vmaxps_avx(auVar146,_DAT_0051a220);
                break;
              case 2:
                auVar140 = vmaxps_avx(auVar146,ZEXT1632(ZEXT816(0) << 0x40));
                auVar146 = vminps_avx(auVar146,ZEXT1632(ZEXT816(0) << 0x40));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar145._4_4_ = uVar1;
                auVar145._0_4_ = uVar1;
                auVar145._8_4_ = uVar1;
                auVar145._12_4_ = uVar1;
                auVar145._16_4_ = uVar1;
                auVar145._20_4_ = uVar1;
                auVar145._24_4_ = uVar1;
                auVar145._28_4_ = uVar1;
                auVar239 = vfmadd213ps_fma(auVar145,auVar146,auVar140);
                auVar146 = ZEXT1632(auVar239);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar224._4_4_ = uVar1;
                auVar224._0_4_ = uVar1;
                auVar224._8_4_ = uVar1;
                auVar224._12_4_ = uVar1;
                auVar224._16_4_ = uVar1;
                auVar224._20_4_ = uVar1;
                auVar224._24_4_ = uVar1;
                auVar224._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar481._4_4_ = uVar1;
                auVar481._0_4_ = uVar1;
                auVar481._8_4_ = uVar1;
                auVar481._12_4_ = uVar1;
                auVar481._16_4_ = uVar1;
                auVar481._20_4_ = uVar1;
                auVar481._24_4_ = uVar1;
                auVar481._28_4_ = uVar1;
                auVar146 = vmaxps_avx(auVar146,auVar224);
                auVar146 = vminps_avx(auVar481,auVar146);
                break;
              case 4:
                auVar141._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
                auVar141._8_4_ = -auVar153._8_4_;
                auVar141._12_4_ = -auVar153._12_4_;
                auVar141._16_4_ = -auVar153._16_4_;
                auVar141._20_4_ = -auVar153._20_4_;
                auVar141._24_4_ = -auVar153._24_4_;
                auVar141._28_4_ = auVar153._28_4_ ^ 0x80000000;
                auVar96._8_4_ = 0x42b0c0a5;
                auVar96._0_8_ = 0x42b0c0a542b0c0a5;
                auVar96._12_4_ = 0x42b0c0a5;
                auVar96._16_4_ = 0x42b0c0a5;
                auVar96._20_4_ = 0x42b0c0a5;
                auVar96._24_4_ = 0x42b0c0a5;
                auVar96._28_4_ = 0x42b0c0a5;
                auVar146 = vminps_avx(auVar141,auVar96);
                auVar136 = vmaxps_avx(auVar136,auVar146);
                auVar239 = vfmadd213ps_fma(auVar149,auVar136,auVar318);
                auVar149 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar239),auVar149,1);
                auVar146 = vandps_avx(auVar146,auVar140);
                auVar146 = vsubps_avx(auVar149,auVar146);
                auVar97._8_4_ = 0x3f318000;
                auVar97._0_8_ = 0x3f3180003f318000;
                auVar97._12_4_ = 0x3f318000;
                auVar97._16_4_ = 0x3f318000;
                auVar97._20_4_ = 0x3f318000;
                auVar97._24_4_ = 0x3f318000;
                auVar97._28_4_ = 0x3f318000;
                auVar239 = vfmsub231ps_fma(auVar136,auVar146,auVar97);
                auVar260._8_4_ = 0x395e8083;
                auVar260._0_8_ = 0x395e8083395e8083;
                auVar260._12_4_ = 0x395e8083;
                auVar260._16_4_ = 0x395e8083;
                auVar260._20_4_ = 0x395e8083;
                auVar260._24_4_ = 0x395e8083;
                auVar260._28_4_ = 0x395e8083;
                auVar407 = vfmsub231ps_fma(ZEXT1632(auVar239),auVar146,auVar260);
                auVar136 = ZEXT1632(auVar407);
                auVar20._28_4_ = auVar149._28_4_;
                auVar20._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar98._8_4_ = 0x3ab743ce;
                auVar98._0_8_ = 0x3ab743ce3ab743ce;
                auVar98._12_4_ = 0x3ab743ce;
                auVar98._16_4_ = 0x3ab743ce;
                auVar98._20_4_ = 0x3ab743ce;
                auVar98._24_4_ = 0x3ab743ce;
                auVar98._28_4_ = 0x3ab743ce;
                auVar239 = vfmadd213ps_fma(auVar142,auVar136,auVar98);
                auVar261._8_4_ = 0x3c088908;
                auVar261._0_8_ = 0x3c0889083c088908;
                auVar261._12_4_ = 0x3c088908;
                auVar261._16_4_ = 0x3c088908;
                auVar261._20_4_ = 0x3c088908;
                auVar261._24_4_ = 0x3c088908;
                auVar261._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar261);
                auVar262._8_4_ = 0x3d2aa9c1;
                auVar262._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar262._12_4_ = 0x3d2aa9c1;
                auVar262._16_4_ = 0x3d2aa9c1;
                auVar262._20_4_ = 0x3d2aa9c1;
                auVar262._24_4_ = 0x3d2aa9c1;
                auVar262._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar262);
                auVar263._8_4_ = 0x3e2aaaaa;
                auVar263._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar263._12_4_ = 0x3e2aaaaa;
                auVar263._16_4_ = 0x3e2aaaaa;
                auVar263._20_4_ = 0x3e2aaaaa;
                auVar263._24_4_ = 0x3e2aaaaa;
                auVar263._28_4_ = 0x3e2aaaaa;
                auVar142 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar142,auVar263);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar142,auVar318);
                auVar332 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar20,auVar142);
                auVar107._0_4_ = (int)auVar146._0_4_;
                auVar107._4_4_ = (int)auVar146._4_4_;
                auVar107._8_4_ = (int)auVar146._8_4_;
                auVar107._12_4_ = (int)auVar146._12_4_;
                auVar143._16_4_ = (int)auVar146._16_4_;
                auVar143._0_16_ = auVar107;
                auVar143._20_4_ = (int)auVar146._20_4_;
                auVar143._24_4_ = (int)auVar146._24_4_;
                auVar143._28_4_ = (int)auVar146._28_4_;
                auVar407 = vpslld_avx(auVar107,0x17);
                auVar239 = vpslld_avx(auVar143._16_16_,0x17);
                auVar240._8_4_ = 0x3f800000;
                auVar240._0_8_ = 0x3f8000003f800000;
                auVar240._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar239,auVar240);
                auVar407 = vpaddd_avx(auVar407,auVar240);
                auVar144._16_16_ = auVar239;
                auVar144._0_16_ = auVar407;
                auVar225._0_4_ = auVar332._0_4_ + fVar62;
                auVar225._4_4_ = auVar332._4_4_ + fVar61;
                auVar225._8_4_ = auVar332._8_4_ + fVar2;
                auVar225._12_4_ = auVar332._12_4_ + fVar3;
                auVar225._16_4_ = fVar238 + 0.0;
                auVar225._20_4_ = fVar486 + 0.0;
                auVar225._24_4_ = fVar487 + 0.0;
                auVar225._28_4_ = fVar12 + 0.0;
                auVar239 = vfmadd213ps_fma(auVar144,auVar225,auVar140);
                auVar146 = vrcpps_avx(ZEXT1632(auVar239));
                auVar239 = vfmsub213ps_fma(ZEXT1632(auVar239),auVar146,auVar140);
                auVar239 = vfnmadd132ps_fma(ZEXT1632(auVar239),auVar146,auVar146);
                auVar146 = ZEXT1632(auVar239);
                break;
              case 5:
                auVar436._8_4_ = 0x42b0c0a5;
                auVar436._0_8_ = 0x42b0c0a542b0c0a5;
                auVar436._12_4_ = 0x42b0c0a5;
                auVar436._16_4_ = 0x42b0c0a5;
                auVar436._20_4_ = 0x42b0c0a5;
                auVar436._24_4_ = 0x42b0c0a5;
                auVar436._28_4_ = 0x42b0c0a5;
                auVar146 = vminps_avx(auVar436,auVar146);
                auVar218 = vmaxps_avx(auVar136,auVar146);
                auVar239 = vfmadd213ps_fma(auVar149,auVar218,auVar318);
                auVar228 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar239),auVar228,1);
                auVar146 = vandps_avx(auVar146,auVar140);
                auVar146 = vsubps_avx(auVar228,auVar146);
                auVar325._8_4_ = 0x3f318000;
                auVar325._0_8_ = 0x3f3180003f318000;
                auVar325._12_4_ = 0x3f318000;
                auVar325._16_4_ = 0x3f318000;
                auVar325._20_4_ = 0x3f318000;
                auVar325._24_4_ = 0x3f318000;
                auVar325._28_4_ = 0x3f318000;
                auVar239 = vfmsub231ps_fma(auVar218,auVar146,auVar325);
                auVar88._8_4_ = 0xb95e8083;
                auVar88._0_8_ = 0xb95e8083b95e8083;
                auVar88._12_4_ = 0xb95e8083;
                auVar88._16_4_ = 0xb95e8083;
                auVar88._20_4_ = 0xb95e8083;
                auVar88._24_4_ = 0xb95e8083;
                auVar88._28_4_ = 0xb95e8083;
                auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar239),auVar146,auVar88);
                auVar218 = ZEXT1632(auVar407);
                auVar17._28_4_ = auVar228._28_4_;
                auVar17._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar405._8_4_ = 0x3ab743ce;
                auVar405._0_8_ = 0x3ab743ce3ab743ce;
                auVar405._12_4_ = 0x3ab743ce;
                auVar405._16_4_ = 0x3ab743ce;
                auVar405._20_4_ = 0x3ab743ce;
                auVar405._24_4_ = 0x3ab743ce;
                auVar405._28_4_ = 0x3ab743ce;
                auVar239 = vfmadd213ps_fma(auVar142,auVar218,auVar405);
                auVar355._8_4_ = 0x3c088908;
                auVar355._0_8_ = 0x3c0889083c088908;
                auVar355._12_4_ = 0x3c088908;
                auVar355._16_4_ = 0x3c088908;
                auVar355._20_4_ = 0x3c088908;
                auVar355._24_4_ = 0x3c088908;
                auVar355._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar218,auVar355);
                auVar301._8_4_ = 0x3d2aa9c1;
                auVar301._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar301._12_4_ = 0x3d2aa9c1;
                auVar301._16_4_ = 0x3d2aa9c1;
                auVar301._20_4_ = 0x3d2aa9c1;
                auVar301._24_4_ = 0x3d2aa9c1;
                auVar301._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar218,auVar301);
                auVar89._8_4_ = 0x3e2aaaaa;
                auVar89._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar89._12_4_ = 0x3e2aaaaa;
                auVar89._16_4_ = 0x3e2aaaaa;
                auVar89._20_4_ = 0x3e2aaaaa;
                auVar89._24_4_ = 0x3e2aaaaa;
                auVar89._28_4_ = 0x3e2aaaaa;
                auVar218 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar218,auVar89);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar218,auVar318);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar17,auVar218);
                auVar219._0_4_ = auVar239._0_4_ + fVar62;
                auVar219._4_4_ = auVar239._4_4_ + fVar61;
                auVar219._8_4_ = auVar239._8_4_ + fVar2;
                auVar219._12_4_ = auVar239._12_4_ + fVar3;
                auVar219._16_4_ = fVar238 + 0.0;
                auVar219._20_4_ = fVar486 + 0.0;
                auVar219._24_4_ = fVar487 + 0.0;
                auVar219._28_4_ = fVar12 + 0.0;
                auVar332._0_4_ = (int)auVar146._0_4_;
                auVar332._4_4_ = (int)auVar146._4_4_;
                auVar332._8_4_ = (int)auVar146._8_4_;
                auVar332._12_4_ = (int)auVar146._12_4_;
                auVar256._16_4_ = (int)auVar146._16_4_;
                auVar256._0_16_ = auVar332;
                auVar256._20_4_ = (int)auVar146._20_4_;
                auVar256._24_4_ = (int)auVar146._24_4_;
                auVar256._28_4_ = (int)auVar146._28_4_;
                auVar407 = vpslld_avx(auVar332,0x17);
                auVar239 = vpslld_avx(auVar256._16_16_,0x17);
                auVar329._8_4_ = 0x3f800000;
                auVar329._0_8_ = 0x3f8000003f800000;
                auVar329._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar329,auVar239);
                auVar407 = vpaddd_avx(auVar407,auVar329);
                auVar479._16_16_ = auVar239;
                auVar479._0_16_ = auVar407;
                auVar332 = vfmadd213ps_fma(auVar479,auVar219,auVar140);
                auVar90._8_4_ = 0x800000;
                auVar90._0_8_ = 0x80000000800000;
                auVar90._12_4_ = 0x800000;
                auVar90._16_4_ = 0x800000;
                auVar90._20_4_ = 0x800000;
                auVar90._24_4_ = 0x800000;
                auVar90._28_4_ = 0x800000;
                auVar146 = vmaxps_avx(ZEXT1632(auVar332),auVar90);
                auVar407 = vpsrld_avx(auVar146._0_16_,0x17);
                auVar239 = vpsrld_avx(auVar146._16_16_,0x17);
                auVar91._8_4_ = 0x807fffff;
                auVar91._0_8_ = 0x807fffff807fffff;
                auVar91._12_4_ = 0x807fffff;
                auVar91._16_4_ = 0x807fffff;
                auVar91._20_4_ = 0x807fffff;
                auVar91._24_4_ = 0x807fffff;
                auVar91._28_4_ = 0x807fffff;
                auVar146 = vandps_avx(auVar146,auVar91);
                auVar228 = vorps_avx(auVar146,auVar318);
                auVar92._8_4_ = 0x3f3504f3;
                auVar92._0_8_ = 0x3f3504f33f3504f3;
                auVar92._12_4_ = 0x3f3504f3;
                auVar92._16_4_ = 0x3f3504f3;
                auVar92._20_4_ = 0x3f3504f3;
                auVar92._24_4_ = 0x3f3504f3;
                auVar92._28_4_ = 0x3f3504f3;
                auVar218 = vcmpps_avx(auVar92,auVar228,2);
                auVar146 = vandnps_avx(auVar218,auVar228);
                auVar220._0_4_ = auVar146._0_4_ + auVar228._0_4_ + -1.0;
                auVar220._4_4_ = auVar146._4_4_ + auVar228._4_4_ + -1.0;
                auVar220._8_4_ = auVar146._8_4_ + auVar228._8_4_ + -1.0;
                auVar220._12_4_ = auVar146._12_4_ + auVar228._12_4_ + -1.0;
                auVar220._16_4_ = auVar146._16_4_ + auVar228._16_4_ + -1.0;
                auVar220._20_4_ = auVar146._20_4_ + auVar228._20_4_ + -1.0;
                auVar220._24_4_ = auVar146._24_4_ + auVar228._24_4_ + -1.0;
                auVar220._28_4_ = auVar146._28_4_ + auVar228._28_4_ + -1.0;
                auVar239 = vpsubd_avx(auVar239,auVar218._16_16_);
                auVar426._8_4_ = 0xffffff81;
                auVar426._0_8_ = 0xffffff81ffffff81;
                auVar426._12_4_ = 0xffffff81;
                auVar239 = vpaddd_avx(auVar239,auVar426);
                auVar407 = vpsubd_avx(auVar407,auVar218._0_16_);
                auVar407 = vpaddd_avx(auVar426,auVar407);
                auVar257._16_16_ = auVar239;
                auVar257._0_16_ = auVar407;
                auVar18._4_4_ = auVar220._4_4_ * auVar220._4_4_;
                auVar18._0_4_ = auVar220._0_4_ * auVar220._0_4_;
                auVar18._8_4_ = auVar220._8_4_ * auVar220._8_4_;
                auVar18._12_4_ = auVar220._12_4_ * auVar220._12_4_;
                auVar18._16_4_ = auVar220._16_4_ * auVar220._16_4_;
                auVar18._20_4_ = auVar220._20_4_ * auVar220._20_4_;
                auVar18._24_4_ = auVar220._24_4_ * auVar220._24_4_;
                auVar18._28_4_ = auVar218._28_4_;
                auVar422._8_4_ = 0x3d9021bb;
                auVar422._0_8_ = 0x3d9021bb3d9021bb;
                auVar422._12_4_ = 0x3d9021bb;
                auVar422._16_4_ = 0x3d9021bb;
                auVar422._20_4_ = 0x3d9021bb;
                auVar422._24_4_ = 0x3d9021bb;
                auVar422._28_4_ = 0x3d9021bb;
                auVar356._8_4_ = 0xbdebd1b8;
                auVar356._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar356._12_4_ = 0xbdebd1b8;
                auVar356._16_4_ = 0xbdebd1b8;
                auVar356._20_4_ = 0xbdebd1b8;
                auVar356._24_4_ = 0xbdebd1b8;
                auVar356._28_4_ = 0xbdebd1b8;
                auVar239 = vfmadd213ps_fma(auVar422,auVar220,auVar356);
                auVar357._8_4_ = 0x3def251a;
                auVar357._0_8_ = 0x3def251a3def251a;
                auVar357._12_4_ = 0x3def251a;
                auVar357._16_4_ = 0x3def251a;
                auVar357._20_4_ = 0x3def251a;
                auVar357._24_4_ = 0x3def251a;
                auVar357._28_4_ = 0x3def251a;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar220,auVar357);
                auVar358._8_4_ = 0xbdfe5d4f;
                auVar358._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar358._12_4_ = 0xbdfe5d4f;
                auVar358._16_4_ = 0xbdfe5d4f;
                auVar358._20_4_ = 0xbdfe5d4f;
                auVar358._24_4_ = 0xbdfe5d4f;
                auVar358._28_4_ = 0xbdfe5d4f;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar220,auVar358);
                auVar359._8_4_ = 0x3e11e9bf;
                auVar359._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar359._12_4_ = 0x3e11e9bf;
                auVar359._16_4_ = 0x3e11e9bf;
                auVar359._20_4_ = 0x3e11e9bf;
                auVar359._24_4_ = 0x3e11e9bf;
                auVar359._28_4_ = 0x3e11e9bf;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar220,auVar359);
                auVar360._8_4_ = 0xbe2aae50;
                auVar360._0_8_ = 0xbe2aae50be2aae50;
                auVar360._12_4_ = 0xbe2aae50;
                auVar360._16_4_ = 0xbe2aae50;
                auVar360._20_4_ = 0xbe2aae50;
                auVar360._24_4_ = 0xbe2aae50;
                auVar360._28_4_ = 0xbe2aae50;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar220,auVar360);
                auVar361._8_4_ = 0x3e4cceac;
                auVar361._0_8_ = 0x3e4cceac3e4cceac;
                auVar361._12_4_ = 0x3e4cceac;
                auVar361._16_4_ = 0x3e4cceac;
                auVar361._20_4_ = 0x3e4cceac;
                auVar361._24_4_ = 0x3e4cceac;
                auVar361._28_4_ = 0x3e4cceac;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar220,auVar361);
                auVar362._8_4_ = 0xbe7ffffc;
                auVar362._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar362._12_4_ = 0xbe7ffffc;
                auVar362._16_4_ = 0xbe7ffffc;
                auVar362._20_4_ = 0xbe7ffffc;
                auVar362._24_4_ = 0xbe7ffffc;
                auVar362._28_4_ = 0xbe7ffffc;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar220,auVar362);
                auVar363._8_4_ = 0x3eaaaaaa;
                auVar363._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar363._12_4_ = 0x3eaaaaaa;
                auVar363._16_4_ = 0x3eaaaaaa;
                auVar363._20_4_ = 0x3eaaaaaa;
                auVar363._24_4_ = 0x3eaaaaaa;
                auVar363._28_4_ = 0x3eaaaaaa;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar220,auVar363);
                auVar423._0_4_ = auVar220._0_4_ * auVar220._0_4_ * auVar220._0_4_ * auVar239._0_4_;
                auVar423._4_4_ = auVar220._4_4_ * auVar220._4_4_ * auVar220._4_4_ * auVar239._4_4_;
                auVar423._8_4_ = auVar220._8_4_ * auVar220._8_4_ * auVar220._8_4_ * auVar239._8_4_;
                auVar423._12_4_ =
                     auVar220._12_4_ * auVar220._12_4_ * auVar220._12_4_ * auVar239._12_4_;
                auVar423._16_4_ = auVar220._16_4_ * auVar220._16_4_ * auVar220._16_4_ * 0.0;
                auVar423._20_4_ = auVar220._20_4_ * auVar220._20_4_ * auVar220._20_4_ * 0.0;
                auVar423._24_4_ = auVar220._24_4_ * auVar220._24_4_ * auVar220._24_4_ * 0.0;
                auVar423._28_4_ = 0;
                auVar218 = vcvtdq2ps_avx(auVar257);
                auVar437._8_4_ = 0xb95e8083;
                auVar437._0_8_ = 0xb95e8083b95e8083;
                auVar437._12_4_ = 0xb95e8083;
                auVar437._16_4_ = 0xb95e8083;
                auVar437._20_4_ = 0xb95e8083;
                auVar437._24_4_ = 0xb95e8083;
                auVar437._28_4_ = 0xb95e8083;
                auVar239 = vfmadd231ps_fma(auVar423,auVar218,auVar437);
                auVar239 = vfmsub231ps_fma(ZEXT1632(auVar239),auVar318,auVar18);
                auVar146 = vcmpps_avx(ZEXT1632(auVar332),ZEXT832(0) << 0x20,2);
                auVar228 = vsubps_avx(ZEXT1632(auVar239),auVar220);
                auVar239 = vfmsub231ps_fma(auVar228,auVar325,auVar218);
                auVar364._8_4_ = 0xc0000000;
                auVar364._0_8_ = 0xc0000000c0000000;
                auVar364._12_4_ = 0xc0000000;
                auVar364._16_4_ = 0xc0000000;
                auVar364._20_4_ = 0xc0000000;
                auVar364._24_4_ = 0xc0000000;
                auVar364._28_4_ = 0xc0000000;
                auVar221._0_4_ = auVar239._0_4_ * -2.0;
                auVar221._4_4_ = auVar239._4_4_ * -2.0;
                auVar221._8_4_ = auVar239._8_4_ * -2.0;
                auVar221._12_4_ = auVar239._12_4_ * -2.0;
                auVar221._16_4_ = 0x80000000;
                auVar221._20_4_ = 0x80000000;
                auVar221._24_4_ = 0x80000000;
                auVar221._28_4_ = 0;
                auVar258._8_4_ = 0x7fffffff;
                auVar258._0_8_ = 0x7fffffff7fffffff;
                auVar258._12_4_ = 0x7fffffff;
                auVar258._16_4_ = 0x7fffffff;
                auVar258._20_4_ = 0x7fffffff;
                auVar258._24_4_ = 0x7fffffff;
                auVar258._28_4_ = 0x7fffffff;
                auVar146 = vblendvps_avx(auVar221,auVar258,auVar146);
                auVar146 = vminps_avx(auVar436,auVar146);
                auVar375 = ZEXT3264(auVar136);
                auVar136 = vmaxps_avx(auVar136,auVar146);
                auVar484 = ZEXT3264(auVar149);
                auVar239 = vfmadd213ps_fma(auVar149,auVar136,auVar318);
                auVar149 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar239),auVar149,1);
                auVar146 = vandps_avx(auVar146,auVar140);
                auVar146 = vsubps_avx(auVar149,auVar146);
                auVar239 = vfmsub231ps_fma(auVar136,auVar146,auVar325);
                auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar239),auVar146,auVar437);
                auVar136 = ZEXT1632(auVar407);
                auVar19._28_4_ = auVar149._28_4_;
                auVar19._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar327 = ZEXT3264(auVar142);
                auVar239 = vfmadd213ps_fma(auVar142,auVar136,auVar405);
                auVar480._8_4_ = 0x3c088908;
                auVar480._0_8_ = 0x3c0889083c088908;
                auVar480._12_4_ = 0x3c088908;
                auVar480._16_4_ = 0x3c088908;
                auVar480._20_4_ = 0x3c088908;
                auVar480._24_4_ = 0x3c088908;
                auVar480._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar480);
                auVar93._8_4_ = 0x3d2aa9c1;
                auVar93._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar93._12_4_ = 0x3d2aa9c1;
                auVar93._16_4_ = 0x3d2aa9c1;
                auVar93._20_4_ = 0x3d2aa9c1;
                auVar93._24_4_ = 0x3d2aa9c1;
                auVar93._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar93);
                auVar94._8_4_ = 0x3e2aaaaa;
                auVar94._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar94._12_4_ = 0x3e2aaaaa;
                auVar94._16_4_ = 0x3e2aaaaa;
                auVar94._20_4_ = 0x3e2aaaaa;
                auVar94._24_4_ = 0x3e2aaaaa;
                auVar94._28_4_ = 0x3e2aaaaa;
                auVar142 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar142,auVar94);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar142,auVar318);
                auVar332 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar19,auVar142);
                auVar319 = ZEXT3264(auVar140);
                auVar156._0_4_ = (int)auVar146._0_4_;
                auVar156._4_4_ = (int)auVar146._4_4_;
                auVar156._8_4_ = (int)auVar146._8_4_;
                auVar156._12_4_ = (int)auVar146._12_4_;
                auVar222._16_4_ = (int)auVar146._16_4_;
                auVar222._0_16_ = auVar156;
                auVar222._20_4_ = (int)auVar146._20_4_;
                auVar222._24_4_ = (int)auVar146._24_4_;
                auVar222._28_4_ = (int)auVar146._28_4_;
                auVar407 = vpslld_avx(auVar156,0x17);
                auVar239 = vpslld_avx(auVar222._16_16_,0x17);
                auVar274._8_4_ = 0x3f800000;
                auVar274._0_8_ = 0x3f8000003f800000;
                auVar274._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar239,auVar274);
                auVar407 = vpaddd_avx(auVar407,auVar274);
                auVar223._16_16_ = auVar239;
                auVar223._0_16_ = auVar407;
                auVar259._0_4_ = auVar332._0_4_ + fVar62;
                auVar259._4_4_ = auVar332._4_4_ + fVar61;
                auVar259._8_4_ = auVar332._8_4_ + fVar2;
                auVar259._12_4_ = auVar332._12_4_ + fVar3;
                auVar259._16_4_ = fVar238 + 0.0;
                auVar259._20_4_ = fVar486 + 0.0;
                auVar259._24_4_ = fVar487 + 0.0;
                auVar259._28_4_ = fVar12 + 0.0;
                auVar239 = vfmadd213ps_fma(auVar223,auVar259,auVar140);
                auVar146 = vrcpps_avx(ZEXT1632(auVar239));
                auVar239 = vfmsub213ps_fma(ZEXT1632(auVar239),auVar146,auVar140);
                auVar239 = vfnmadd132ps_fma(ZEXT1632(auVar239),auVar146,auVar146);
                auVar95._8_4_ = 0xbf800000;
                auVar95._0_8_ = 0xbf800000bf800000;
                auVar95._12_4_ = 0xbf800000;
                auVar95._16_4_ = 0xbf800000;
                auVar95._20_4_ = 0xbf800000;
                auVar95._24_4_ = 0xbf800000;
                auVar95._28_4_ = 0xbf800000;
                auVar239 = vfnmadd213ps_fma(ZEXT1632(auVar239),auVar364,auVar95);
                auVar204 = ZEXT1628(auVar239);
                goto LAB_004f63fc;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar226._4_4_ = uVar1;
                auVar226._0_4_ = uVar1;
                auVar226._8_4_ = uVar1;
                auVar226._12_4_ = uVar1;
                auVar226._16_4_ = uVar1;
                auVar226._20_4_ = uVar1;
                auVar226._24_4_ = uVar1;
                auVar226._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar264._4_4_ = uVar1;
                auVar264._0_4_ = uVar1;
                auVar264._8_4_ = uVar1;
                auVar264._12_4_ = uVar1;
                auVar264._16_4_ = uVar1;
                auVar264._20_4_ = uVar1;
                auVar264._24_4_ = uVar1;
                auVar264._28_4_ = uVar1;
                auVar239 = vfmadd231ps_fma(auVar264,auVar146,auVar226);
                auVar146 = vmaxps_avx(ZEXT1632(auVar239),_DAT_0051a220);
                auVar146 = vminps_avx(auVar146,auVar140);
                auVar204 = auVar146._0_28_;
LAB_004f63fc:
                auVar485._0_4_ = auVar204._0_4_ * auVar153._0_4_;
                auVar485._4_4_ = auVar204._4_4_ * auVar153._4_4_;
                auVar485._8_4_ = auVar204._8_4_ * auVar153._8_4_;
                auVar485._12_4_ = auVar204._12_4_ * auVar153._12_4_;
                auVar485._16_4_ = auVar204._16_4_ * auVar153._16_4_;
                auVar485._20_4_ = auVar204._20_4_ * auVar153._20_4_;
                auVar485._24_4_ = auVar204._24_4_ * auVar153._24_4_;
                auVar146 = auVar485._0_32_;
              }
              *pauVar41 = auVar146;
              pauVar41 = pauVar41 + 1;
              bVar57 = iVar35 != iVar5;
              iVar35 = iVar35 + 1;
            } while (bVar57);
          }
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar30);
      }
      if ((bVar58 && bVar56) && iVar4 == 4) {
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        local_110 = 0;
        auVar484 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar319 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar153 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar327 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar375 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        do {
          if (-1 < iVar5) {
            pauVar41 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar35 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar485 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar485 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                     local_110 * 0x20));
              }
              if (iVar29 < 1) {
                auVar154 = ZEXT3264(auVar485._0_32_);
              }
              else {
                pauVar54 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_110 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var9 = pp_Var8[-3];
                puVar37 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar50) * 4 + 4);
                uVar47 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var9) < 1) {
                    auVar154 = ZEXT3264(auVar485._0_32_);
                  }
                  else {
                    puVar36 = puVar37;
                    iVar32 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      uVar1 = puVar36[-3];
                      auVar147._4_4_ = uVar1;
                      auVar147._0_4_ = uVar1;
                      auVar147._8_4_ = uVar1;
                      auVar147._12_4_ = uVar1;
                      auVar147._16_4_ = uVar1;
                      auVar147._20_4_ = uVar1;
                      auVar147._24_4_ = uVar1;
                      auVar147._28_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar227._4_4_ = uVar1;
                      auVar227._0_4_ = uVar1;
                      auVar227._8_4_ = uVar1;
                      auVar227._12_4_ = uVar1;
                      auVar227._16_4_ = uVar1;
                      auVar227._20_4_ = uVar1;
                      auVar227._24_4_ = uVar1;
                      auVar227._28_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar265._4_4_ = uVar1;
                      auVar265._0_4_ = uVar1;
                      auVar265._8_4_ = uVar1;
                      auVar265._12_4_ = uVar1;
                      auVar265._16_4_ = uVar1;
                      auVar265._20_4_ = uVar1;
                      auVar265._24_4_ = uVar1;
                      auVar265._28_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar313._4_4_ = uVar1;
                      auVar313._0_4_ = uVar1;
                      auVar313._8_4_ = uVar1;
                      auVar313._12_4_ = uVar1;
                      auVar313._16_4_ = uVar1;
                      auVar313._20_4_ = uVar1;
                      auVar313._24_4_ = uVar1;
                      auVar313._28_4_ = uVar1;
                      auVar239 = vfmadd132ps_fma(auVar147,auVar485._0_32_,*pauVar54);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar227,pauVar54[1]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar265,pauVar54[2]);
                      auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar313,pauVar54[3]);
                      auVar154 = ZEXT1664(auVar239);
                      pauVar54 = pauVar54 + 4;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 2);
                      auVar485 = ZEXT1664(auVar239);
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                  uVar47 = uVar47 + 1;
                  puVar37 = (undefined4 *)((long)puVar37 + (long)local_a8.w * local_a8.elemsize);
                  auVar485 = ZEXT3264(auVar154._0_32_);
                } while (uVar47 != uVar52);
              }
              auVar146 = auVar154._0_32_;
              auVar142 = auVar327._0_32_;
              auVar136 = auVar375._0_32_;
              auVar140 = auVar319._0_32_;
              auVar149 = auVar484._0_32_;
              auVar218 = auVar153._0_32_;
              auVar155._28_36_ = auVar154._28_36_;
              fVar62 = auVar327._0_4_;
              fVar61 = auVar327._4_4_;
              fVar2 = auVar327._8_4_;
              fVar3 = auVar327._12_4_;
              fVar238 = auVar327._16_4_;
              fVar486 = auVar327._20_4_;
              fVar487 = auVar327._24_4_;
              fVar12 = auVar327._28_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar146 = vmaxps_avx(auVar146,_DAT_0051a220);
                break;
              case 2:
                auVar140 = vmaxps_avx(auVar146,ZEXT1632(ZEXT816(0) << 0x40));
                auVar146 = vminps_avx(auVar146,ZEXT1632(ZEXT816(0) << 0x40));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar152._4_4_ = uVar1;
                auVar152._0_4_ = uVar1;
                auVar152._8_4_ = uVar1;
                auVar152._12_4_ = uVar1;
                auVar152._16_4_ = uVar1;
                auVar152._20_4_ = uVar1;
                auVar152._24_4_ = uVar1;
                auVar152._28_4_ = uVar1;
                auVar239 = vfmadd213ps_fma(auVar152,auVar146,auVar140);
                auVar146 = ZEXT1632(auVar239);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar235._4_4_ = uVar1;
                auVar235._0_4_ = uVar1;
                auVar235._8_4_ = uVar1;
                auVar235._12_4_ = uVar1;
                auVar235._16_4_ = uVar1;
                auVar235._20_4_ = uVar1;
                auVar235._24_4_ = uVar1;
                auVar235._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar483._4_4_ = uVar1;
                auVar483._0_4_ = uVar1;
                auVar483._8_4_ = uVar1;
                auVar483._12_4_ = uVar1;
                auVar483._16_4_ = uVar1;
                auVar483._20_4_ = uVar1;
                auVar483._24_4_ = uVar1;
                auVar483._28_4_ = uVar1;
                auVar146 = vmaxps_avx(auVar146,auVar235);
                auVar146 = vminps_avx(auVar483,auVar146);
                break;
              case 4:
                auVar148._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
                auVar148._8_4_ = -auVar154._8_4_;
                auVar148._12_4_ = -auVar154._12_4_;
                auVar148._16_4_ = -auVar154._16_4_;
                auVar148._20_4_ = -auVar154._20_4_;
                auVar148._24_4_ = -auVar154._24_4_;
                auVar148._28_4_ = auVar154._28_4_ ^ 0x80000000;
                auVar102._8_4_ = 0x42b0c0a5;
                auVar102._0_8_ = 0x42b0c0a542b0c0a5;
                auVar102._12_4_ = 0x42b0c0a5;
                auVar102._16_4_ = 0x42b0c0a5;
                auVar102._20_4_ = 0x42b0c0a5;
                auVar102._24_4_ = 0x42b0c0a5;
                auVar102._28_4_ = 0x42b0c0a5;
                auVar146 = vminps_avx(auVar148,auVar102);
                auVar149 = vmaxps_avx(auVar149,auVar146);
                auVar239 = vfmadd213ps_fma(auVar218,auVar149,auVar140);
                auVar218 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar239),auVar218,1);
                auVar146 = vandps_avx(auVar146,auVar142);
                auVar146 = vsubps_avx(auVar218,auVar146);
                auVar103._8_4_ = 0x3f318000;
                auVar103._0_8_ = 0x3f3180003f318000;
                auVar103._12_4_ = 0x3f318000;
                auVar103._16_4_ = 0x3f318000;
                auVar103._20_4_ = 0x3f318000;
                auVar103._24_4_ = 0x3f318000;
                auVar103._28_4_ = 0x3f318000;
                auVar239 = vfmsub231ps_fma(auVar149,auVar146,auVar103);
                auVar270._8_4_ = 0x395e8083;
                auVar270._0_8_ = 0x395e8083395e8083;
                auVar270._12_4_ = 0x395e8083;
                auVar270._16_4_ = 0x395e8083;
                auVar270._20_4_ = 0x395e8083;
                auVar270._24_4_ = 0x395e8083;
                auVar270._28_4_ = 0x395e8083;
                auVar407 = vfmsub231ps_fma(ZEXT1632(auVar239),auVar146,auVar270);
                auVar149 = ZEXT1632(auVar407);
                auVar24._28_4_ = auVar218._28_4_;
                auVar24._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar104._8_4_ = 0x3ab743ce;
                auVar104._0_8_ = 0x3ab743ce3ab743ce;
                auVar104._12_4_ = 0x3ab743ce;
                auVar104._16_4_ = 0x3ab743ce;
                auVar104._20_4_ = 0x3ab743ce;
                auVar104._24_4_ = 0x3ab743ce;
                auVar104._28_4_ = 0x3ab743ce;
                auVar239 = vfmadd213ps_fma(auVar136,auVar149,auVar104);
                auVar271._8_4_ = 0x3c088908;
                auVar271._0_8_ = 0x3c0889083c088908;
                auVar271._12_4_ = 0x3c088908;
                auVar271._16_4_ = 0x3c088908;
                auVar271._20_4_ = 0x3c088908;
                auVar271._24_4_ = 0x3c088908;
                auVar271._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar149,auVar271);
                auVar272._8_4_ = 0x3d2aa9c1;
                auVar272._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar272._12_4_ = 0x3d2aa9c1;
                auVar272._16_4_ = 0x3d2aa9c1;
                auVar272._20_4_ = 0x3d2aa9c1;
                auVar272._24_4_ = 0x3d2aa9c1;
                auVar272._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar149,auVar272);
                auVar105._8_4_ = 0x3e2aaaaa;
                auVar105._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar105._12_4_ = 0x3e2aaaaa;
                auVar105._16_4_ = 0x3e2aaaaa;
                auVar105._20_4_ = 0x3e2aaaaa;
                auVar105._24_4_ = 0x3e2aaaaa;
                auVar105._28_4_ = 0x3e2aaaaa;
                auVar136 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar105);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar140);
                auVar332 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar24,auVar136);
                auVar108._0_4_ = (int)auVar146._0_4_;
                auVar108._4_4_ = (int)auVar146._4_4_;
                auVar108._8_4_ = (int)auVar146._8_4_;
                auVar108._12_4_ = (int)auVar146._12_4_;
                auVar150._16_4_ = (int)auVar146._16_4_;
                auVar150._0_16_ = auVar108;
                auVar150._20_4_ = (int)auVar146._20_4_;
                auVar150._24_4_ = (int)auVar146._24_4_;
                auVar150._28_4_ = (int)auVar146._28_4_;
                auVar407 = vpslld_avx(auVar108,0x17);
                auVar239 = vpslld_avx(auVar150._16_16_,0x17);
                auVar65._8_4_ = 0x3f800000;
                auVar65._0_8_ = 0x3f8000003f800000;
                auVar65._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar239,auVar65);
                auVar407 = vpaddd_avx(auVar407,auVar65);
                auVar151._16_16_ = auVar239;
                auVar151._0_16_ = auVar407;
                auVar236._0_4_ = auVar332._0_4_ + fVar62;
                auVar236._4_4_ = auVar332._4_4_ + fVar61;
                auVar236._8_4_ = auVar332._8_4_ + fVar2;
                auVar236._12_4_ = auVar332._12_4_ + fVar3;
                auVar236._16_4_ = fVar238 + 0.0;
                auVar236._20_4_ = fVar486 + 0.0;
                auVar236._24_4_ = fVar487 + 0.0;
                auVar236._28_4_ = fVar12 + 0.0;
                auVar239 = vfmadd213ps_fma(auVar151,auVar236,auVar142);
                auVar146 = vrcpps_avx(ZEXT1632(auVar239));
                auVar239 = vfmsub213ps_fma(ZEXT1632(auVar239),auVar146,auVar142);
                auVar239 = vfnmadd132ps_fma(ZEXT1632(auVar239),auVar146,auVar146);
                auVar146 = ZEXT1632(auVar239);
                break;
              case 5:
                auVar438._8_4_ = 0x42b0c0a5;
                auVar438._0_8_ = 0x42b0c0a542b0c0a5;
                auVar438._12_4_ = 0x42b0c0a5;
                auVar438._16_4_ = 0x42b0c0a5;
                auVar438._20_4_ = 0x42b0c0a5;
                auVar438._24_4_ = 0x42b0c0a5;
                auVar438._28_4_ = 0x42b0c0a5;
                auVar146 = vminps_avx(auVar438,auVar146);
                auVar228 = vmaxps_avx(auVar149,auVar146);
                auVar239 = vfmadd213ps_fma(auVar218,auVar228,auVar140);
                auVar446 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar239),auVar446,1);
                auVar146 = vandps_avx(auVar146,auVar142);
                auVar146 = vsubps_avx(auVar446,auVar146);
                auVar326._8_4_ = 0x3f318000;
                auVar326._0_8_ = 0x3f3180003f318000;
                auVar326._12_4_ = 0x3f318000;
                auVar326._16_4_ = 0x3f318000;
                auVar326._20_4_ = 0x3f318000;
                auVar326._24_4_ = 0x3f318000;
                auVar326._28_4_ = 0x3f318000;
                auVar239 = vfmsub231ps_fma(auVar228,auVar146,auVar326);
                auVar99._8_4_ = 0xb95e8083;
                auVar99._0_8_ = 0xb95e8083b95e8083;
                auVar99._12_4_ = 0xb95e8083;
                auVar99._16_4_ = 0xb95e8083;
                auVar99._20_4_ = 0xb95e8083;
                auVar99._24_4_ = 0xb95e8083;
                auVar99._28_4_ = 0xb95e8083;
                auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar239),auVar146,auVar99);
                auVar228 = ZEXT1632(auVar407);
                auVar21._28_4_ = auVar446._28_4_;
                auVar21._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar406._8_4_ = 0x3ab743ce;
                auVar406._0_8_ = 0x3ab743ce3ab743ce;
                auVar406._12_4_ = 0x3ab743ce;
                auVar406._16_4_ = 0x3ab743ce;
                auVar406._20_4_ = 0x3ab743ce;
                auVar406._24_4_ = 0x3ab743ce;
                auVar406._28_4_ = 0x3ab743ce;
                auVar239 = vfmadd213ps_fma(auVar136,auVar228,auVar406);
                auVar365._8_4_ = 0x3c088908;
                auVar365._0_8_ = 0x3c0889083c088908;
                auVar365._12_4_ = 0x3c088908;
                auVar365._16_4_ = 0x3c088908;
                auVar365._20_4_ = 0x3c088908;
                auVar365._24_4_ = 0x3c088908;
                auVar365._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar228,auVar365);
                auVar302._8_4_ = 0x3d2aa9c1;
                auVar302._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar302._12_4_ = 0x3d2aa9c1;
                auVar302._16_4_ = 0x3d2aa9c1;
                auVar302._20_4_ = 0x3d2aa9c1;
                auVar302._24_4_ = 0x3d2aa9c1;
                auVar302._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar228,auVar302);
                auVar303._8_4_ = 0x3e2aaaaa;
                auVar303._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar303._12_4_ = 0x3e2aaaaa;
                auVar303._16_4_ = 0x3e2aaaaa;
                auVar303._20_4_ = 0x3e2aaaaa;
                auVar303._24_4_ = 0x3e2aaaaa;
                auVar303._28_4_ = 0x3e2aaaaa;
                auVar228 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar228,auVar303);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar228,auVar140);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar21,auVar228);
                auVar229._0_4_ = auVar239._0_4_ + fVar62;
                auVar229._4_4_ = auVar239._4_4_ + fVar61;
                auVar229._8_4_ = auVar239._8_4_ + fVar2;
                auVar229._12_4_ = auVar239._12_4_ + fVar3;
                auVar229._16_4_ = fVar238 + 0.0;
                auVar229._20_4_ = fVar486 + 0.0;
                auVar229._24_4_ = fVar487 + 0.0;
                auVar229._28_4_ = fVar12 + 0.0;
                auVar241._0_4_ = (int)auVar146._0_4_;
                auVar241._4_4_ = (int)auVar146._4_4_;
                auVar241._8_4_ = (int)auVar146._8_4_;
                auVar241._12_4_ = (int)auVar146._12_4_;
                auVar266._16_4_ = (int)auVar146._16_4_;
                auVar266._0_16_ = auVar241;
                auVar266._20_4_ = (int)auVar146._20_4_;
                auVar266._24_4_ = (int)auVar146._24_4_;
                auVar266._28_4_ = (int)auVar146._28_4_;
                auVar407 = vpslld_avx(auVar241,0x17);
                auVar239 = vpslld_avx(auVar266._16_16_,0x17);
                auVar330._8_4_ = 0x3f800000;
                auVar330._0_8_ = 0x3f8000003f800000;
                auVar330._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar330,auVar239);
                auVar407 = vpaddd_avx(auVar407,auVar330);
                auVar482._16_16_ = auVar239;
                auVar482._0_16_ = auVar407;
                auVar332 = vfmadd213ps_fma(auVar482,auVar229,auVar142);
                auVar230._8_4_ = 0x800000;
                auVar230._0_8_ = 0x80000000800000;
                auVar230._12_4_ = 0x800000;
                auVar230._16_4_ = 0x800000;
                auVar230._20_4_ = 0x800000;
                auVar230._24_4_ = 0x800000;
                auVar230._28_4_ = 0x800000;
                auVar146 = vmaxps_avx(ZEXT1632(auVar332),auVar230);
                auVar407 = vpsrld_avx(auVar146._0_16_,0x17);
                auVar239 = vpsrld_avx(auVar146._16_16_,0x17);
                auVar304._8_4_ = 0x807fffff;
                auVar304._0_8_ = 0x807fffff807fffff;
                auVar304._12_4_ = 0x807fffff;
                auVar304._16_4_ = 0x807fffff;
                auVar304._20_4_ = 0x807fffff;
                auVar304._24_4_ = 0x807fffff;
                auVar304._28_4_ = 0x807fffff;
                auVar146 = vandps_avx(auVar146,auVar304);
                auVar446 = vorps_avx(auVar146,auVar140);
                auVar305._8_4_ = 0x3f3504f3;
                auVar305._0_8_ = 0x3f3504f33f3504f3;
                auVar305._12_4_ = 0x3f3504f3;
                auVar305._16_4_ = 0x3f3504f3;
                auVar305._20_4_ = 0x3f3504f3;
                auVar305._24_4_ = 0x3f3504f3;
                auVar305._28_4_ = 0x3f3504f3;
                auVar228 = vcmpps_avx(auVar305,auVar446,2);
                auVar146 = vandnps_avx(auVar228,auVar446);
                auVar231._0_4_ = auVar146._0_4_ + auVar446._0_4_ + -1.0;
                auVar231._4_4_ = auVar146._4_4_ + auVar446._4_4_ + -1.0;
                auVar231._8_4_ = auVar146._8_4_ + auVar446._8_4_ + -1.0;
                auVar231._12_4_ = auVar146._12_4_ + auVar446._12_4_ + -1.0;
                auVar231._16_4_ = auVar146._16_4_ + auVar446._16_4_ + -1.0;
                auVar231._20_4_ = auVar146._20_4_ + auVar446._20_4_ + -1.0;
                auVar231._24_4_ = auVar146._24_4_ + auVar446._24_4_ + -1.0;
                auVar231._28_4_ = auVar146._28_4_ + auVar446._28_4_ + -1.0;
                auVar239 = vpsubd_avx(auVar239,auVar228._16_16_);
                auVar427._8_4_ = 0xffffff81;
                auVar427._0_8_ = 0xffffff81ffffff81;
                auVar427._12_4_ = 0xffffff81;
                auVar239 = vpaddd_avx(auVar239,auVar427);
                auVar407 = vpsubd_avx(auVar407,auVar228._0_16_);
                auVar407 = vpaddd_avx(auVar427,auVar407);
                auVar267._16_16_ = auVar239;
                auVar267._0_16_ = auVar407;
                auVar22._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                auVar22._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                auVar22._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                auVar22._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                auVar22._16_4_ = auVar231._16_4_ * auVar231._16_4_;
                auVar22._20_4_ = auVar231._20_4_ * auVar231._20_4_;
                auVar22._24_4_ = auVar231._24_4_ * auVar231._24_4_;
                auVar22._28_4_ = auVar228._28_4_;
                auVar424._8_4_ = 0x3d9021bb;
                auVar424._0_8_ = 0x3d9021bb3d9021bb;
                auVar424._12_4_ = 0x3d9021bb;
                auVar424._16_4_ = 0x3d9021bb;
                auVar424._20_4_ = 0x3d9021bb;
                auVar424._24_4_ = 0x3d9021bb;
                auVar424._28_4_ = 0x3d9021bb;
                auVar366._8_4_ = 0xbdebd1b8;
                auVar366._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar366._12_4_ = 0xbdebd1b8;
                auVar366._16_4_ = 0xbdebd1b8;
                auVar366._20_4_ = 0xbdebd1b8;
                auVar366._24_4_ = 0xbdebd1b8;
                auVar366._28_4_ = 0xbdebd1b8;
                auVar239 = vfmadd213ps_fma(auVar424,auVar231,auVar366);
                auVar367._8_4_ = 0x3def251a;
                auVar367._0_8_ = 0x3def251a3def251a;
                auVar367._12_4_ = 0x3def251a;
                auVar367._16_4_ = 0x3def251a;
                auVar367._20_4_ = 0x3def251a;
                auVar367._24_4_ = 0x3def251a;
                auVar367._28_4_ = 0x3def251a;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar231,auVar367);
                auVar368._8_4_ = 0xbdfe5d4f;
                auVar368._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar368._12_4_ = 0xbdfe5d4f;
                auVar368._16_4_ = 0xbdfe5d4f;
                auVar368._20_4_ = 0xbdfe5d4f;
                auVar368._24_4_ = 0xbdfe5d4f;
                auVar368._28_4_ = 0xbdfe5d4f;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar231,auVar368);
                auVar369._8_4_ = 0x3e11e9bf;
                auVar369._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar369._12_4_ = 0x3e11e9bf;
                auVar369._16_4_ = 0x3e11e9bf;
                auVar369._20_4_ = 0x3e11e9bf;
                auVar369._24_4_ = 0x3e11e9bf;
                auVar369._28_4_ = 0x3e11e9bf;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar231,auVar369);
                auVar370._8_4_ = 0xbe2aae50;
                auVar370._0_8_ = 0xbe2aae50be2aae50;
                auVar370._12_4_ = 0xbe2aae50;
                auVar370._16_4_ = 0xbe2aae50;
                auVar370._20_4_ = 0xbe2aae50;
                auVar370._24_4_ = 0xbe2aae50;
                auVar370._28_4_ = 0xbe2aae50;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar231,auVar370);
                auVar371._8_4_ = 0x3e4cceac;
                auVar371._0_8_ = 0x3e4cceac3e4cceac;
                auVar371._12_4_ = 0x3e4cceac;
                auVar371._16_4_ = 0x3e4cceac;
                auVar371._20_4_ = 0x3e4cceac;
                auVar371._24_4_ = 0x3e4cceac;
                auVar371._28_4_ = 0x3e4cceac;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar231,auVar371);
                auVar372._8_4_ = 0xbe7ffffc;
                auVar372._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar372._12_4_ = 0xbe7ffffc;
                auVar372._16_4_ = 0xbe7ffffc;
                auVar372._20_4_ = 0xbe7ffffc;
                auVar372._24_4_ = 0xbe7ffffc;
                auVar372._28_4_ = 0xbe7ffffc;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar231,auVar372);
                auVar373._8_4_ = 0x3eaaaaaa;
                auVar373._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar373._12_4_ = 0x3eaaaaaa;
                auVar373._16_4_ = 0x3eaaaaaa;
                auVar373._20_4_ = 0x3eaaaaaa;
                auVar373._24_4_ = 0x3eaaaaaa;
                auVar373._28_4_ = 0x3eaaaaaa;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar231,auVar373);
                auVar425._0_4_ = auVar231._0_4_ * auVar231._0_4_ * auVar231._0_4_ * auVar239._0_4_;
                auVar425._4_4_ = auVar231._4_4_ * auVar231._4_4_ * auVar231._4_4_ * auVar239._4_4_;
                auVar425._8_4_ = auVar231._8_4_ * auVar231._8_4_ * auVar231._8_4_ * auVar239._8_4_;
                auVar425._12_4_ =
                     auVar231._12_4_ * auVar231._12_4_ * auVar231._12_4_ * auVar239._12_4_;
                auVar425._16_4_ = auVar231._16_4_ * auVar231._16_4_ * auVar231._16_4_ * 0.0;
                auVar425._20_4_ = auVar231._20_4_ * auVar231._20_4_ * auVar231._20_4_ * 0.0;
                auVar425._24_4_ = auVar231._24_4_ * auVar231._24_4_ * auVar231._24_4_ * 0.0;
                auVar425._28_4_ = 0;
                auVar228 = vcvtdq2ps_avx(auVar267);
                auVar439._8_4_ = 0xb95e8083;
                auVar439._0_8_ = 0xb95e8083b95e8083;
                auVar439._12_4_ = 0xb95e8083;
                auVar439._16_4_ = 0xb95e8083;
                auVar439._20_4_ = 0xb95e8083;
                auVar439._24_4_ = 0xb95e8083;
                auVar439._28_4_ = 0xb95e8083;
                auVar239 = vfmadd231ps_fma(auVar425,auVar228,auVar439);
                auVar239 = vfmsub231ps_fma(ZEXT1632(auVar239),auVar140,auVar22);
                auVar146 = vcmpps_avx(ZEXT1632(auVar332),ZEXT832(0) << 0x20,2);
                auVar446 = vsubps_avx(ZEXT1632(auVar239),auVar231);
                auVar239 = vfmsub231ps_fma(auVar446,auVar326,auVar228);
                auVar374._8_4_ = 0xc0000000;
                auVar374._0_8_ = 0xc0000000c0000000;
                auVar374._12_4_ = 0xc0000000;
                auVar374._16_4_ = 0xc0000000;
                auVar374._20_4_ = 0xc0000000;
                auVar374._24_4_ = 0xc0000000;
                auVar374._28_4_ = 0xc0000000;
                auVar232._0_4_ = auVar239._0_4_ * -2.0;
                auVar232._4_4_ = auVar239._4_4_ * -2.0;
                auVar232._8_4_ = auVar239._8_4_ * -2.0;
                auVar232._12_4_ = auVar239._12_4_ * -2.0;
                auVar232._16_4_ = 0x80000000;
                auVar232._20_4_ = 0x80000000;
                auVar232._24_4_ = 0x80000000;
                auVar232._28_4_ = 0;
                auVar268._8_4_ = 0x7fffffff;
                auVar268._0_8_ = 0x7fffffff7fffffff;
                auVar268._12_4_ = 0x7fffffff;
                auVar268._16_4_ = 0x7fffffff;
                auVar268._20_4_ = 0x7fffffff;
                auVar268._24_4_ = 0x7fffffff;
                auVar268._28_4_ = 0x7fffffff;
                auVar146 = vblendvps_avx(auVar232,auVar268,auVar146);
                auVar146 = vminps_avx(auVar438,auVar146);
                auVar484 = ZEXT3264(auVar149);
                auVar149 = vmaxps_avx(auVar149,auVar146);
                auVar153 = ZEXT3264(auVar218);
                auVar239 = vfmadd213ps_fma(auVar218,auVar149,auVar140);
                auVar218 = vroundps_avx(ZEXT1632(auVar239),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar239),auVar218,1);
                auVar146 = vandps_avx(auVar146,auVar142);
                auVar146 = vsubps_avx(auVar218,auVar146);
                auVar239 = vfmsub231ps_fma(auVar149,auVar146,auVar326);
                auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar239),auVar146,auVar439);
                auVar149 = ZEXT1632(auVar407);
                auVar23._28_4_ = auVar218._28_4_;
                auVar23._0_28_ =
                     ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                        CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                                 CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                          auVar407._0_4_ * auVar407._0_4_))));
                auVar375 = ZEXT3264(auVar136);
                auVar239 = vfmadd213ps_fma(auVar136,auVar149,auVar406);
                auVar306._8_4_ = 0x3c088908;
                auVar306._0_8_ = 0x3c0889083c088908;
                auVar306._12_4_ = 0x3c088908;
                auVar306._16_4_ = 0x3c088908;
                auVar306._20_4_ = 0x3c088908;
                auVar306._24_4_ = 0x3c088908;
                auVar306._28_4_ = 0x3c088908;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar149,auVar306);
                auVar307._8_4_ = 0x3d2aa9c1;
                auVar307._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar307._12_4_ = 0x3d2aa9c1;
                auVar307._16_4_ = 0x3d2aa9c1;
                auVar307._20_4_ = 0x3d2aa9c1;
                auVar307._24_4_ = 0x3d2aa9c1;
                auVar307._28_4_ = 0x3d2aa9c1;
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar149,auVar307);
                auVar319 = ZEXT3264(auVar140);
                auVar327 = ZEXT3264(auVar142);
                auVar100._8_4_ = 0x3e2aaaaa;
                auVar100._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar100._12_4_ = 0x3e2aaaaa;
                auVar100._16_4_ = 0x3e2aaaaa;
                auVar100._20_4_ = 0x3e2aaaaa;
                auVar100._24_4_ = 0x3e2aaaaa;
                auVar100._28_4_ = 0x3e2aaaaa;
                auVar136 = ZEXT1632(auVar407);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar100);
                auVar239 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar136,auVar140);
                auVar332 = vfmadd213ps_fma(ZEXT1632(auVar239),auVar23,auVar136);
                auVar157._0_4_ = (int)auVar146._0_4_;
                auVar157._4_4_ = (int)auVar146._4_4_;
                auVar157._8_4_ = (int)auVar146._8_4_;
                auVar157._12_4_ = (int)auVar146._12_4_;
                auVar233._16_4_ = (int)auVar146._16_4_;
                auVar233._0_16_ = auVar157;
                auVar233._20_4_ = (int)auVar146._20_4_;
                auVar233._24_4_ = (int)auVar146._24_4_;
                auVar233._28_4_ = (int)auVar146._28_4_;
                auVar407 = vpslld_avx(auVar157,0x17);
                auVar239 = vpslld_avx(auVar233._16_16_,0x17);
                auVar64._8_4_ = 0x3f800000;
                auVar64._0_8_ = 0x3f8000003f800000;
                auVar64._12_4_ = 0x3f800000;
                auVar239 = vpaddd_avx(auVar239,auVar64);
                auVar407 = vpaddd_avx(auVar407,auVar64);
                auVar234._16_16_ = auVar239;
                auVar234._0_16_ = auVar407;
                auVar269._0_4_ = auVar332._0_4_ + fVar62;
                auVar269._4_4_ = auVar332._4_4_ + fVar61;
                auVar269._8_4_ = auVar332._8_4_ + fVar2;
                auVar269._12_4_ = auVar332._12_4_ + fVar3;
                auVar269._16_4_ = fVar238 + 0.0;
                auVar269._20_4_ = fVar486 + 0.0;
                auVar269._24_4_ = fVar487 + 0.0;
                auVar269._28_4_ = fVar12 + 0.0;
                auVar239 = vfmadd213ps_fma(auVar234,auVar269,auVar142);
                auVar146 = vrcpps_avx(ZEXT1632(auVar239));
                auVar239 = vfmsub213ps_fma(ZEXT1632(auVar239),auVar146,auVar142);
                auVar239 = vfnmadd132ps_fma(ZEXT1632(auVar239),auVar146,auVar146);
                auVar101._8_4_ = 0xbf800000;
                auVar101._0_8_ = 0xbf800000bf800000;
                auVar101._12_4_ = 0xbf800000;
                auVar101._16_4_ = 0xbf800000;
                auVar101._20_4_ = 0xbf800000;
                auVar101._24_4_ = 0xbf800000;
                auVar101._28_4_ = 0xbf800000;
                auVar239 = vfnmadd213ps_fma(ZEXT1632(auVar239),auVar374,auVar101);
                auVar204 = ZEXT1628(auVar239);
                goto LAB_004f6a3f;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar237._4_4_ = uVar1;
                auVar237._0_4_ = uVar1;
                auVar237._8_4_ = uVar1;
                auVar237._12_4_ = uVar1;
                auVar237._16_4_ = uVar1;
                auVar237._20_4_ = uVar1;
                auVar237._24_4_ = uVar1;
                auVar237._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar273._4_4_ = uVar1;
                auVar273._0_4_ = uVar1;
                auVar273._8_4_ = uVar1;
                auVar273._12_4_ = uVar1;
                auVar273._16_4_ = uVar1;
                auVar273._20_4_ = uVar1;
                auVar273._24_4_ = uVar1;
                auVar273._28_4_ = uVar1;
                auVar239 = vfmadd231ps_fma(auVar273,auVar146,auVar237);
                auVar146 = vmaxps_avx(ZEXT1632(auVar239),_DAT_0051a220);
                auVar146 = vminps_avx(auVar146,auVar142);
                auVar204 = auVar146._0_28_;
LAB_004f6a3f:
                auVar155._0_4_ = auVar204._0_4_ * auVar154._0_4_;
                auVar155._4_4_ = auVar204._4_4_ * auVar154._4_4_;
                auVar155._8_4_ = auVar204._8_4_ * auVar154._8_4_;
                auVar155._12_4_ = auVar204._12_4_ * auVar154._12_4_;
                auVar155._16_4_ = auVar204._16_4_ * auVar154._16_4_;
                auVar155._20_4_ = auVar204._20_4_ * auVar154._20_4_;
                auVar155._24_4_ = auVar204._24_4_ * auVar154._24_4_;
                auVar146 = auVar155._0_32_;
              }
              *pauVar41 = auVar146;
              pauVar41 = pauVar41 + 1;
              iVar50 = iVar50 + 4;
              bVar58 = iVar35 != iVar5;
              iVar35 = iVar35 + 1;
            } while (bVar58);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar30);
      }
      bVar58 = 0 < (int)uVar30;
      bVar56 = iVar33 == 1;
      if (iVar4 == 8 && (bVar56 && bVar58)) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        local_50 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_58 = (this->weight_data_packed).data;
        local_38 = (ulong)uVar30;
        local_100 = 0;
        do {
          pvVar28 = local_40;
          pvVar10 = local_a8.data;
          if (-1 < iVar5) {
            lVar53 = local_48 * local_100;
            pauVar41 = (undefined1 (*) [32])(local_50 * local_100 + (long)local_58);
            lVar51 = (long)local_a8.w * local_a8.elemsize;
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar35 = 0;
            uVar47 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                fVar62 = 0.0;
              }
              else {
                fVar62 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var6) + local_100 * 4);
              }
              if (iVar29 < 1) {
                auVar146 = SUB6432(ZEXT864(0),0);
              }
              else {
                p_Var9 = pp_Var8[-3];
                pauVar54 = (undefined1 (*) [32])
                           ((long)(_func_int ***)pvVar10 +
                           (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar35) * 4);
                auVar319 = ZEXT864(0);
                uVar45 = 0;
                pauVar42 = pauVar41;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var9)) {
                    pauVar48 = pauVar54;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      auVar239 = vfmadd231ps_fma(auVar319._0_32_,*pauVar42,*pauVar48);
                      auVar319 = ZEXT1664(auVar239);
                      pauVar42 = pauVar42 + 1;
                      pauVar48 = (undefined1 (*) [32])
                                 (*pauVar48 +
                                 (long)(*(int *)(&this->field_0xd8 + (long)p_Var9) << 3) * 4);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  auVar146 = auVar319._0_32_;
                  uVar45 = uVar45 + 1;
                  pauVar54 = (undefined1 (*) [32])(*pauVar54 + lVar51);
                } while (uVar45 != uVar52);
              }
              auVar109._0_4_ = auVar146._16_4_ + auVar146._0_4_;
              auVar109._4_4_ = auVar146._20_4_ + auVar146._4_4_;
              auVar109._8_4_ = auVar146._24_4_ + auVar146._8_4_;
              auVar109._12_4_ = auVar146._28_4_ + auVar146._12_4_;
              auVar239 = vshufpd_avx(auVar109,auVar109,1);
              auVar110._0_4_ = auVar239._0_4_ + auVar109._0_4_;
              auVar110._4_4_ = auVar239._4_4_ + auVar109._4_4_;
              auVar110._8_4_ = auVar239._8_4_ + auVar109._8_4_;
              auVar110._12_4_ = auVar239._12_4_ + auVar109._12_4_;
              auVar239 = vmovshdup_avx(auVar110);
              fVar62 = auVar239._0_4_ + fVar62 + auVar110._0_4_;
              fVar61 = fVar62;
              if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                auVar239 = ZEXT416((uint)fVar62);
                switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar239 = vmaxss_avx(auVar239,ZEXT416(0));
                  fVar61 = auVar239._0_4_;
                  break;
                case 2:
                  auVar66._0_12_ = ZEXT812(0);
                  auVar66._12_4_ = 0;
                  auVar239 = vcmpss_avx(auVar66,auVar239,1);
                  auVar159._8_4_ = 0x3f800000;
                  auVar159._0_8_ = 0x3f8000003f800000;
                  auVar159._12_4_ = 0x3f800000;
                  auVar239 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)),
                                           auVar159,auVar239);
                  fVar61 = auVar239._0_4_ * fVar62;
                  break;
                case 3:
                  fVar62 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar239 = vmaxss_avx(auVar239,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                    (long)p_Var6)));
                  fVar61 = auVar239._0_4_;
                  if (fVar62 < auVar239._0_4_) {
                    fVar61 = fVar62;
                  }
                  break;
                case 4:
                  auVar239 = vminss_avx(auVar239,ZEXT416(0x42b0c0a5));
                  auVar111._0_8_ = auVar239._0_8_ ^ 0x8000000080000000;
                  auVar111._8_4_ = auVar239._8_4_ ^ 0x80000000;
                  auVar111._12_4_ = auVar239._12_4_ ^ 0x80000000;
                  auVar239 = vcmpss_avx(auVar239,ZEXT416(0xc2b0c0a5),1);
                  auVar158._8_4_ = 0x42b0c0a5;
                  auVar158._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar158._12_4_ = 0x42b0c0a5;
                  auVar239 = vblendvps_avx(auVar111,auVar158,auVar239);
                  fVar62 = expf(auVar239._0_4_);
                  fVar61 = 1.0 / (fVar62 + 1.0);
                  break;
                case 5:
                  fVar61 = expf(fVar62);
                  fVar61 = logf(fVar61 + 1.0);
                  fVar61 = tanhf(fVar61);
                  fVar61 = fVar61 * fVar62;
                  break;
                case 6:
                  fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                  fVar3 = (*(float **)(&this->field_0xf8 + (long)p_Var6))[1];
                  fVar238 = -fVar3 / fVar2;
                  fVar61 = 0.0;
                  if ((fVar238 <= fVar62) && (fVar61 = fVar62, fVar62 <= fVar238 + 1.0 / fVar2)) {
                    auVar239 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar62),
                                               ZEXT416((uint)fVar3));
                    fVar61 = auVar239._0_4_ * fVar62;
                  }
                }
              }
              *(float *)((long)pvVar28 + uVar47 * 4 + lVar53) = fVar61;
              uVar47 = uVar47 + 1;
              iVar35 = iVar35 + 8;
            } while (uVar47 != _w);
          }
          local_100 = local_100 + 1;
        } while (local_100 != local_38);
      }
      bVar57 = 0 < (int)uVar30;
      bVar59 = iVar33 == 4;
      if (iVar4 == 8 && (bVar59 && bVar57)) {
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        local_110 = 0;
        auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar308._8_4_ = 0x3f000000;
        auVar308._0_8_ = 0x3f0000003f000000;
        auVar308._12_4_ = 0x3f000000;
        auVar319 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar456._8_4_ = 0x3ab743ce;
        auVar456._0_8_ = 0x3ab743ce3ab743ce;
        auVar456._12_4_ = 0x3ab743ce;
        do {
          if (-1 < iVar5) {
            pauVar43 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar35 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar112 = ZEXT816(0) << 0x40;
              }
              else {
                auVar112 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var6) + local_110 * 0x10);
              }
              if (0 < iVar29) {
                pauVar55 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_110 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var9 = pp_Var8[-3];
                puVar37 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar50) * 4 + 4);
                uVar47 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var9)) {
                    puVar36 = puVar37;
                    iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      uVar1 = puVar36[-7];
                      auVar461._4_4_ = uVar1;
                      auVar461._0_4_ = uVar1;
                      auVar461._8_4_ = uVar1;
                      auVar461._12_4_ = uVar1;
                      uVar1 = puVar36[-6];
                      auVar160._4_4_ = uVar1;
                      auVar160._0_4_ = uVar1;
                      auVar160._8_4_ = uVar1;
                      auVar160._12_4_ = uVar1;
                      uVar1 = puVar36[-5];
                      auVar275._4_4_ = uVar1;
                      auVar275._0_4_ = uVar1;
                      auVar275._8_4_ = uVar1;
                      auVar275._12_4_ = uVar1;
                      uVar1 = puVar36[-4];
                      auVar331._4_4_ = uVar1;
                      auVar331._0_4_ = uVar1;
                      auVar331._8_4_ = uVar1;
                      auVar331._12_4_ = uVar1;
                      uVar1 = puVar36[-3];
                      auVar376._4_4_ = uVar1;
                      auVar376._0_4_ = uVar1;
                      auVar376._8_4_ = uVar1;
                      auVar376._12_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar408._4_4_ = uVar1;
                      auVar408._0_4_ = uVar1;
                      auVar408._8_4_ = uVar1;
                      auVar408._12_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar428._4_4_ = uVar1;
                      auVar428._0_4_ = uVar1;
                      auVar428._8_4_ = uVar1;
                      auVar428._12_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar440._4_4_ = uVar1;
                      auVar440._0_4_ = uVar1;
                      auVar440._8_4_ = uVar1;
                      auVar440._12_4_ = uVar1;
                      auVar239 = vfmadd132ps_fma(auVar461,auVar112,*pauVar55);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar160,pauVar55[1]);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar275,pauVar55[2]);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar331,pauVar55[3]);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar376,pauVar55[4]);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar408,pauVar55[5]);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar428,pauVar55[6]);
                      auVar112 = vfmadd231ps_fma(auVar239,auVar440,pauVar55[7]);
                      pauVar55 = pauVar55 + 8;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 3);
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar47 = uVar47 + 1;
                  puVar37 = (undefined4 *)((long)puVar37 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar47 != uVar52);
              }
              auVar407 = auVar327._0_16_;
              auVar239 = auVar319._0_16_;
              fVar62 = auVar319._0_4_;
              fVar61 = auVar319._4_4_;
              fVar2 = auVar319._8_4_;
              fVar3 = auVar319._12_4_;
              fVar238 = auVar112._4_4_;
              fVar486 = auVar112._8_4_;
              fVar487 = auVar112._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar112 = vmaxps_avx(auVar112,auVar407);
                break;
              case 2:
                auVar239 = vmaxps_avx(auVar112,auVar407);
                auVar407 = vminps_avx(auVar112,auVar407);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar464._4_4_ = uVar1;
                auVar464._0_4_ = uVar1;
                auVar464._8_4_ = uVar1;
                auVar464._12_4_ = uVar1;
                auVar112 = vfmadd213ps_fma(auVar464,auVar407,auVar239);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar115._4_4_ = uVar1;
                auVar115._0_4_ = uVar1;
                auVar115._8_4_ = uVar1;
                auVar115._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar334._4_4_ = uVar1;
                auVar334._0_4_ = uVar1;
                auVar334._8_4_ = uVar1;
                auVar334._12_4_ = uVar1;
                auVar239 = vmaxps_avx(auVar112,auVar115);
                auVar112 = vminps_avx(auVar334,auVar239);
                break;
              case 4:
                auVar116._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
                auVar116._8_4_ = -fVar486;
                auVar116._12_4_ = -fVar487;
                auVar167._8_4_ = 0x42b0c0a5;
                auVar167._0_8_ = 0x42b0c0a542b0c0a5;
                auVar167._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar116,auVar167);
                auVar168._8_4_ = 0xc2b0c0a5;
                auVar168._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar168._12_4_ = 0xc2b0c0a5;
                auVar415 = vmaxps_avx(auVar407,auVar168);
                auVar335._8_4_ = 0x3fb8aa3b;
                auVar335._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar335._12_4_ = 0x3fb8aa3b;
                auVar407 = vfmadd213ps_fma(auVar335,auVar415,auVar308);
                auVar462._0_4_ = (int)auVar407._0_4_;
                auVar462._4_4_ = (int)auVar407._4_4_;
                auVar462._8_4_ = (int)auVar407._8_4_;
                auVar462._12_4_ = (int)auVar407._12_4_;
                auVar332 = vcvtdq2ps_avx(auVar462);
                auVar407 = vcmpps_avx(auVar407,auVar332,1);
                auVar407 = vandps_avx(auVar407,auVar239);
                auVar407 = vsubps_avx(auVar332,auVar407);
                auVar69._8_4_ = 0x3f318000;
                auVar69._0_8_ = 0x3f3180003f318000;
                auVar69._12_4_ = 0x3f318000;
                auVar332 = vfmsub231ps_fma(auVar415,auVar407,auVar69);
                auVar169._8_4_ = 0x395e8083;
                auVar169._0_8_ = 0x395e8083395e8083;
                auVar169._12_4_ = 0x395e8083;
                auVar415 = vfmsub231ps_fma(auVar332,auVar407,auVar169);
                auVar463._0_4_ = auVar415._0_4_ * auVar415._0_4_;
                auVar463._4_4_ = auVar415._4_4_ * auVar415._4_4_;
                auVar463._8_4_ = auVar415._8_4_ * auVar415._8_4_;
                auVar463._12_4_ = auVar415._12_4_ * auVar415._12_4_;
                auVar412._8_4_ = 0x39506967;
                auVar412._0_8_ = 0x3950696739506967;
                auVar412._12_4_ = 0x39506967;
                auVar170._8_4_ = 0x3ab743ce;
                auVar170._0_8_ = 0x3ab743ce3ab743ce;
                auVar170._12_4_ = 0x3ab743ce;
                auVar332 = vfmadd213ps_fma(auVar412,auVar415,auVar170);
                auVar171._8_4_ = 0x3c088908;
                auVar171._0_8_ = 0x3c0889083c088908;
                auVar171._12_4_ = 0x3c088908;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar171);
                auVar70._8_4_ = 0x3d2aa9c1;
                auVar70._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar70._12_4_ = 0x3d2aa9c1;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar70);
                auVar71._8_4_ = 0x3e2aaaaa;
                auVar71._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar71._12_4_ = 0x3e2aaaaa;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar71);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar308);
                auVar332 = vfmadd213ps_fma(auVar332,auVar463,auVar415);
                auVar117._0_4_ = auVar332._0_4_ + fVar62;
                auVar117._4_4_ = auVar332._4_4_ + fVar61;
                auVar117._8_4_ = auVar332._8_4_ + fVar2;
                auVar117._12_4_ = auVar332._12_4_ + fVar3;
                auVar336._0_4_ = (int)auVar407._0_4_;
                auVar336._4_4_ = (int)auVar407._4_4_;
                auVar336._8_4_ = (int)auVar407._8_4_;
                auVar336._12_4_ = (int)auVar407._12_4_;
                auVar407 = vpslld_avx(auVar336,0x17);
                auVar407 = vpaddd_avx(auVar407,auVar239);
                auVar332 = vfmadd213ps_fma(auVar407,auVar117,auVar239);
                auVar407 = vrcpps_avx(auVar332);
                auVar239 = vfmsub213ps_fma(auVar332,auVar407,auVar239);
                auVar112 = vfnmadd132ps_fma(auVar239,auVar407,auVar407);
                break;
              case 5:
                auVar429._8_4_ = 0x42b0c0a5;
                auVar429._0_8_ = 0x42b0c0a542b0c0a5;
                auVar429._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar112,auVar429);
                auVar441._8_4_ = 0xc2b0c0a5;
                auVar441._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar441._12_4_ = 0xc2b0c0a5;
                auVar415 = vmaxps_avx(auVar441,auVar407);
                auVar450._8_4_ = 0x3fb8aa3b;
                auVar450._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar450._12_4_ = 0x3fb8aa3b;
                auVar407 = vfmadd213ps_fma(auVar450,auVar415,auVar308);
                auVar409._0_4_ = (int)auVar407._0_4_;
                auVar409._4_4_ = (int)auVar407._4_4_;
                auVar409._8_4_ = (int)auVar407._8_4_;
                auVar409._12_4_ = (int)auVar407._12_4_;
                auVar332 = vcvtdq2ps_avx(auVar409);
                auVar407 = vcmpps_avx(auVar407,auVar332,1);
                auVar407 = vandps_avx(auVar407,auVar239);
                auVar407 = vsubps_avx(auVar332,auVar407);
                auVar430._8_4_ = 0x3f318000;
                auVar430._0_8_ = 0x3f3180003f318000;
                auVar430._12_4_ = 0x3f318000;
                auVar332 = vfmsub231ps_fma(auVar415,auVar407,auVar430);
                auVar314._8_4_ = 0xb95e8083;
                auVar314._0_8_ = 0xb95e8083b95e8083;
                auVar314._12_4_ = 0xb95e8083;
                auVar415 = vfnmsub231ps_fma(auVar332,auVar407,auVar314);
                auVar410._0_4_ = auVar415._0_4_ * auVar415._0_4_;
                auVar410._4_4_ = auVar415._4_4_ * auVar415._4_4_;
                auVar410._8_4_ = auVar415._8_4_ * auVar415._8_4_;
                auVar410._12_4_ = auVar415._12_4_ * auVar415._12_4_;
                auVar320._8_4_ = 0x39506967;
                auVar320._0_8_ = 0x3950696739506967;
                auVar320._12_4_ = 0x39506967;
                auVar332 = vfmadd213ps_fma(auVar320,auVar415,auVar456);
                auVar242._8_4_ = 0x3c088908;
                auVar242._0_8_ = 0x3c0889083c088908;
                auVar242._12_4_ = 0x3c088908;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar242);
                auVar243._8_4_ = 0x3d2aa9c1;
                auVar243._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar243._12_4_ = 0x3d2aa9c1;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar243);
                auVar276._8_4_ = 0x3e2aaaaa;
                auVar276._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar276._12_4_ = 0x3e2aaaaa;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar276);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar308);
                auVar332 = vfmadd213ps_fma(auVar332,auVar410,auVar415);
                auVar161._0_4_ = auVar332._0_4_ + fVar62;
                auVar161._4_4_ = auVar332._4_4_ + fVar61;
                auVar161._8_4_ = auVar332._8_4_ + fVar2;
                auVar161._12_4_ = auVar332._12_4_ + fVar3;
                auVar113._0_4_ = (int)auVar407._0_4_;
                auVar113._4_4_ = (int)auVar407._4_4_;
                auVar113._8_4_ = (int)auVar407._8_4_;
                auVar113._12_4_ = (int)auVar407._12_4_;
                auVar407 = vpslld_avx(auVar113,0x17);
                auVar407 = vpaddd_avx(auVar407,auVar239);
                auVar63 = vfmadd213ps_fma(auVar407,auVar161,auVar239);
                auVar162._8_4_ = 0x800000;
                auVar162._0_8_ = 0x80000000800000;
                auVar162._12_4_ = 0x800000;
                auVar407 = vmaxps_avx(auVar63,auVar162);
                auVar332 = vpsrld_avx(auVar407,0x17);
                auVar277._8_4_ = 0xffffff82;
                auVar277._0_8_ = 0xffffff82ffffff82;
                auVar277._12_4_ = 0xffffff82;
                auVar332 = vpaddd_avx(auVar332,auVar277);
                auVar278._8_4_ = 0x807fffff;
                auVar278._0_8_ = 0x807fffff807fffff;
                auVar278._12_4_ = 0x807fffff;
                auVar407 = vandps_avx(auVar407,auVar278);
                auVar328 = vorps_avx(auVar407,auVar308);
                auVar415 = vcvtdq2ps_avx(auVar332);
                auVar279._8_4_ = 0x3f3504f3;
                auVar279._0_8_ = 0x3f3504f33f3504f3;
                auVar279._12_4_ = 0x3f3504f3;
                auVar332 = vcmpps_avx(auVar328,auVar279,1);
                auVar407 = vandps_avx(auVar332,auVar328);
                auVar163._0_4_ = auVar328._0_4_ + -1.0 + auVar407._0_4_;
                auVar163._4_4_ = auVar328._4_4_ + -1.0 + auVar407._4_4_;
                auVar163._8_4_ = auVar328._8_4_ + -1.0 + auVar407._8_4_;
                auVar163._12_4_ = auVar328._12_4_ + -1.0 + auVar407._12_4_;
                auVar407 = vandps_avx(auVar332,auVar239);
                auVar332 = vsubps_avx(auVar415,auVar407);
                auVar333._0_4_ = auVar163._0_4_ * auVar163._0_4_;
                auVar333._4_4_ = auVar163._4_4_ * auVar163._4_4_;
                auVar333._8_4_ = auVar163._8_4_ * auVar163._8_4_;
                auVar333._12_4_ = auVar163._12_4_ * auVar163._12_4_;
                auVar411._8_4_ = 0x3d9021bb;
                auVar411._0_8_ = 0x3d9021bb3d9021bb;
                auVar411._12_4_ = 0x3d9021bb;
                auVar377._8_4_ = 0xbdebd1b8;
                auVar377._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar377._12_4_ = 0xbdebd1b8;
                auVar407 = vfmadd213ps_fma(auVar411,auVar163,auVar377);
                auVar378._8_4_ = 0x3def251a;
                auVar378._0_8_ = 0x3def251a3def251a;
                auVar378._12_4_ = 0x3def251a;
                auVar407 = vfmadd213ps_fma(auVar407,auVar163,auVar378);
                auVar379._8_4_ = 0xbdfe5d4f;
                auVar379._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar379._12_4_ = 0xbdfe5d4f;
                auVar407 = vfmadd213ps_fma(auVar407,auVar163,auVar379);
                auVar380._8_4_ = 0x3e11e9bf;
                auVar380._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar380._12_4_ = 0x3e11e9bf;
                auVar407 = vfmadd213ps_fma(auVar407,auVar163,auVar380);
                auVar381._8_4_ = 0xbe2aae50;
                auVar381._0_8_ = 0xbe2aae50be2aae50;
                auVar381._12_4_ = 0xbe2aae50;
                auVar407 = vfmadd213ps_fma(auVar407,auVar163,auVar381);
                auVar382._8_4_ = 0x3e4cceac;
                auVar382._0_8_ = 0x3e4cceac3e4cceac;
                auVar382._12_4_ = 0x3e4cceac;
                auVar407 = vfmadd213ps_fma(auVar407,auVar163,auVar382);
                auVar383._8_4_ = 0xbe7ffffc;
                auVar383._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar383._12_4_ = 0xbe7ffffc;
                auVar407 = vfmadd213ps_fma(auVar407,auVar163,auVar383);
                auVar384._8_4_ = 0x3eaaaaaa;
                auVar384._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar384._12_4_ = 0x3eaaaaaa;
                auVar407 = vfmadd213ps_fma(auVar407,auVar163,auVar384);
                auVar385._0_4_ = auVar333._0_4_ * auVar163._0_4_ * auVar407._0_4_;
                auVar385._4_4_ = auVar333._4_4_ * auVar163._4_4_ * auVar407._4_4_;
                auVar385._8_4_ = auVar333._8_4_ * auVar163._8_4_ * auVar407._8_4_;
                auVar385._12_4_ = auVar333._12_4_ * auVar163._12_4_ * auVar407._12_4_;
                auVar407 = vfmadd231ps_fma(auVar385,auVar332,auVar314);
                auVar415 = vfmsub231ps_fma(auVar407,auVar308,auVar333);
                auVar407 = vcmpps_avx(auVar63,_DAT_00515040,2);
                auVar415 = vsubps_avx(auVar415,auVar163);
                auVar332 = vfnmadd231ps_fma(auVar415,auVar430,auVar332);
                auVar164._0_4_ = auVar332._0_4_ + auVar332._0_4_;
                auVar164._4_4_ = auVar332._4_4_ + auVar332._4_4_;
                auVar164._8_4_ = auVar332._8_4_ + auVar332._8_4_;
                auVar164._12_4_ = auVar332._12_4_ + auVar332._12_4_;
                auVar280._8_4_ = 0x7fffffff;
                auVar280._0_8_ = 0x7fffffff7fffffff;
                auVar280._12_4_ = 0x7fffffff;
                auVar407 = vblendvps_avx(auVar164,auVar280,auVar407);
                auVar165._8_4_ = 0x42b0c0a5;
                auVar165._0_8_ = 0x42b0c0a542b0c0a5;
                auVar165._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar407,auVar165);
                auVar415 = vmaxps_avx(auVar441,auVar407);
                auVar407 = vfmadd213ps_fma(auVar450,auVar415,auVar308);
                auVar281._0_4_ = (int)auVar407._0_4_;
                auVar281._4_4_ = (int)auVar407._4_4_;
                auVar281._8_4_ = (int)auVar407._8_4_;
                auVar281._12_4_ = (int)auVar407._12_4_;
                auVar332 = vcvtdq2ps_avx(auVar281);
                auVar407 = vcmpps_avx(auVar407,auVar332,1);
                auVar407 = vandps_avx(auVar407,auVar239);
                auVar407 = vsubps_avx(auVar332,auVar407);
                auVar332 = vfmsub231ps_fma(auVar415,auVar407,auVar430);
                auVar415 = vfnmsub231ps_fma(auVar332,auVar407,auVar314);
                auVar282._0_4_ = auVar415._0_4_ * auVar415._0_4_;
                auVar282._4_4_ = auVar415._4_4_ * auVar415._4_4_;
                auVar282._8_4_ = auVar415._8_4_ * auVar415._8_4_;
                auVar282._12_4_ = auVar415._12_4_ * auVar415._12_4_;
                auVar332 = vfmadd213ps_fma(auVar320,auVar415,auVar456);
                auVar315._8_4_ = 0x3c088908;
                auVar315._0_8_ = 0x3c0889083c088908;
                auVar315._12_4_ = 0x3c088908;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar315);
                auVar327 = ZEXT864(0) << 0x20;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar243);
                auVar319 = ZEXT1664(auVar239);
                auVar67._8_4_ = 0x3e2aaaaa;
                auVar67._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar67._12_4_ = 0x3e2aaaaa;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar67);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar308);
                auVar332 = vfmadd213ps_fma(auVar332,auVar282,auVar415);
                auVar114._0_4_ = auVar332._0_4_ + fVar62;
                auVar114._4_4_ = auVar332._4_4_ + fVar61;
                auVar114._8_4_ = auVar332._8_4_ + fVar2;
                auVar114._12_4_ = auVar332._12_4_ + fVar3;
                auVar166._0_4_ = (int)auVar407._0_4_;
                auVar166._4_4_ = (int)auVar407._4_4_;
                auVar166._8_4_ = (int)auVar407._8_4_;
                auVar166._12_4_ = (int)auVar407._12_4_;
                auVar407 = vpslld_avx(auVar166,0x17);
                auVar407 = vpaddd_avx(auVar407,auVar239);
                auVar407 = vfmadd213ps_fma(auVar407,auVar114,auVar239);
                auVar239 = vrcpps_avx(auVar407);
                auVar283._0_4_ = auVar239._0_4_ + auVar239._0_4_;
                auVar283._4_4_ = auVar239._4_4_ + auVar239._4_4_;
                auVar283._8_4_ = auVar239._8_4_ + auVar239._8_4_;
                auVar283._12_4_ = auVar239._12_4_ + auVar239._12_4_;
                auVar68._8_4_ = 0x40000000;
                auVar68._0_8_ = 0x4000000040000000;
                auVar68._12_4_ = 0x40000000;
                auVar407 = vfmsub213ps_fma(auVar407,auVar283,auVar68);
                auVar239 = vfnmadd213ps_fma(auVar407,auVar239,auVar283);
                auVar112 = vfmsub231ps_fma(auVar112,auVar112,auVar239);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar118._4_4_ = uVar1;
                auVar118._0_4_ = uVar1;
                auVar118._8_4_ = uVar1;
                auVar118._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar172._4_4_ = uVar1;
                auVar172._0_4_ = uVar1;
                auVar172._8_4_ = uVar1;
                auVar172._12_4_ = uVar1;
                auVar332 = vfmadd231ps_fma(auVar172,auVar112,auVar118);
                auVar407 = vmaxps_avx(auVar332,auVar407);
                auVar239 = vminps_avx(auVar407,auVar239);
                auVar112._0_4_ = auVar112._0_4_ * auVar239._0_4_;
                auVar112._4_4_ = fVar238 * auVar239._4_4_;
                auVar112._8_4_ = fVar486 * auVar239._8_4_;
                auVar112._12_4_ = fVar487 * auVar239._12_4_;
              }
              *pauVar43 = auVar112;
              pauVar43 = pauVar43 + 1;
              iVar50 = iVar50 + 8;
              bVar60 = iVar35 != iVar5;
              iVar35 = iVar35 + 1;
            } while (bVar60);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar30);
      }
      if (iVar4 == 4 && (bVar59 && bVar57)) {
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        local_110 = 0;
        auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar316._8_4_ = 0x3f000000;
        auVar316._0_8_ = 0x3f0000003f000000;
        auVar316._12_4_ = 0x3f000000;
        auVar319 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar457._8_4_ = 0x3ab743ce;
        auVar457._0_8_ = 0x3ab743ce3ab743ce;
        auVar457._12_4_ = 0x3ab743ce;
        auVar244._8_4_ = 0x3c088908;
        auVar244._0_8_ = 0x3c0889083c088908;
        auVar244._12_4_ = 0x3c088908;
        do {
          if (-1 < iVar5) {
            pauVar43 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar50 = 0;
            iVar35 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar119 = ZEXT816(0) << 0x40;
              }
              else {
                auVar119 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var6) + local_110 * 0x10);
              }
              if (0 < iVar29) {
                pauVar55 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_110 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var9 = pp_Var8[-3];
                puVar37 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar50) * 4 + 4);
                uVar47 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var9)) {
                    puVar36 = puVar37;
                    iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      uVar1 = puVar36[-3];
                      auVar337._4_4_ = uVar1;
                      auVar337._0_4_ = uVar1;
                      auVar337._8_4_ = uVar1;
                      auVar337._12_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar173._4_4_ = uVar1;
                      auVar173._0_4_ = uVar1;
                      auVar173._8_4_ = uVar1;
                      auVar173._12_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar284._4_4_ = uVar1;
                      auVar284._0_4_ = uVar1;
                      auVar284._8_4_ = uVar1;
                      auVar284._12_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar386._4_4_ = uVar1;
                      auVar386._0_4_ = uVar1;
                      auVar386._8_4_ = uVar1;
                      auVar386._12_4_ = uVar1;
                      auVar239 = vfmadd132ps_fma(auVar337,auVar119,*pauVar55);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar173,pauVar55[1]);
                      auVar239 = vfmadd231ps_fma(auVar239,auVar284,pauVar55[2]);
                      auVar119 = vfmadd231ps_fma(auVar239,auVar386,pauVar55[3]);
                      pauVar55 = pauVar55 + 4;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 2);
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar47 = uVar47 + 1;
                  puVar37 = (undefined4 *)((long)puVar37 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar47 != uVar52);
              }
              auVar407 = auVar327._0_16_;
              auVar239 = auVar319._0_16_;
              fVar62 = auVar319._0_4_;
              fVar61 = auVar319._4_4_;
              fVar2 = auVar319._8_4_;
              fVar3 = auVar319._12_4_;
              fVar238 = auVar119._4_4_;
              fVar486 = auVar119._8_4_;
              fVar487 = auVar119._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar119 = vmaxps_avx(auVar119,auVar407);
                break;
              case 2:
                auVar239 = vmaxps_avx(auVar119,auVar407);
                auVar407 = vminps_avx(auVar119,auVar407);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar340._4_4_ = uVar1;
                auVar340._0_4_ = uVar1;
                auVar340._8_4_ = uVar1;
                auVar340._12_4_ = uVar1;
                auVar119 = vfmadd213ps_fma(auVar340,auVar407,auVar239);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar122._4_4_ = uVar1;
                auVar122._0_4_ = uVar1;
                auVar122._8_4_ = uVar1;
                auVar122._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar468._4_4_ = uVar1;
                auVar468._0_4_ = uVar1;
                auVar468._8_4_ = uVar1;
                auVar468._12_4_ = uVar1;
                auVar239 = vmaxps_avx(auVar119,auVar122);
                auVar119 = vminps_avx(auVar468,auVar239);
                break;
              case 4:
                auVar123._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
                auVar123._8_4_ = -fVar486;
                auVar123._12_4_ = -fVar487;
                auVar181._8_4_ = 0x42b0c0a5;
                auVar181._0_8_ = 0x42b0c0a542b0c0a5;
                auVar181._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar123,auVar181);
                auVar182._8_4_ = 0xc2b0c0a5;
                auVar182._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar182._12_4_ = 0xc2b0c0a5;
                auVar415 = vmaxps_avx(auVar407,auVar182);
                auVar338._8_4_ = 0x3fb8aa3b;
                auVar338._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar338._12_4_ = 0x3fb8aa3b;
                auVar407 = vfmadd213ps_fma(auVar338,auVar415,auVar316);
                auVar469._0_4_ = (int)auVar407._0_4_;
                auVar469._4_4_ = (int)auVar407._4_4_;
                auVar469._8_4_ = (int)auVar407._8_4_;
                auVar469._12_4_ = (int)auVar407._12_4_;
                auVar332 = vcvtdq2ps_avx(auVar469);
                auVar407 = vcmpps_avx(auVar407,auVar332,1);
                auVar407 = vandps_avx(auVar407,auVar239);
                auVar407 = vsubps_avx(auVar332,auVar407);
                auVar74._8_4_ = 0x3f318000;
                auVar74._0_8_ = 0x3f3180003f318000;
                auVar74._12_4_ = 0x3f318000;
                auVar332 = vfmsub231ps_fma(auVar415,auVar407,auVar74);
                auVar183._8_4_ = 0x395e8083;
                auVar183._0_8_ = 0x395e8083395e8083;
                auVar183._12_4_ = 0x395e8083;
                auVar415 = vfmsub231ps_fma(auVar332,auVar407,auVar183);
                auVar470._0_4_ = auVar415._0_4_ * auVar415._0_4_;
                auVar470._4_4_ = auVar415._4_4_ * auVar415._4_4_;
                auVar470._8_4_ = auVar415._8_4_ * auVar415._8_4_;
                auVar470._12_4_ = auVar415._12_4_ * auVar415._12_4_;
                auVar414._8_4_ = 0x39506967;
                auVar414._0_8_ = 0x3950696739506967;
                auVar414._12_4_ = 0x39506967;
                auVar184._8_4_ = 0x3ab743ce;
                auVar184._0_8_ = 0x3ab743ce3ab743ce;
                auVar184._12_4_ = 0x3ab743ce;
                auVar332 = vfmadd213ps_fma(auVar414,auVar415,auVar184);
                auVar185._8_4_ = 0x3c088908;
                auVar185._0_8_ = 0x3c0889083c088908;
                auVar185._12_4_ = 0x3c088908;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar185);
                auVar75._8_4_ = 0x3d2aa9c1;
                auVar75._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar75._12_4_ = 0x3d2aa9c1;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar75);
                auVar76._8_4_ = 0x3e2aaaaa;
                auVar76._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar76._12_4_ = 0x3e2aaaaa;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar76);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar316);
                auVar332 = vfmadd213ps_fma(auVar332,auVar470,auVar415);
                auVar124._0_4_ = auVar332._0_4_ + fVar62;
                auVar124._4_4_ = auVar332._4_4_ + fVar61;
                auVar124._8_4_ = auVar332._8_4_ + fVar2;
                auVar124._12_4_ = auVar332._12_4_ + fVar3;
                auVar327 = ZEXT864(0) << 0x20;
                auVar339._0_4_ = (int)auVar407._0_4_;
                auVar339._4_4_ = (int)auVar407._4_4_;
                auVar339._8_4_ = (int)auVar407._8_4_;
                auVar339._12_4_ = (int)auVar407._12_4_;
                auVar407 = vpslld_avx(auVar339,0x17);
                auVar407 = vpaddd_avx(auVar407,auVar239);
                auVar332 = vfmadd213ps_fma(auVar407,auVar124,auVar239);
                auVar407 = vrcpps_avx(auVar332);
                auVar239 = vfmsub213ps_fma(auVar332,auVar407,auVar239);
                auVar119 = vfnmadd132ps_fma(auVar239,auVar407,auVar407);
                break;
              case 5:
                auVar431._8_4_ = 0x42b0c0a5;
                auVar431._0_8_ = 0x42b0c0a542b0c0a5;
                auVar431._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar119,auVar431);
                auVar442._8_4_ = 0xc2b0c0a5;
                auVar442._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar442._12_4_ = 0xc2b0c0a5;
                auVar415 = vmaxps_avx(auVar442,auVar407);
                auVar451._8_4_ = 0x3fb8aa3b;
                auVar451._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar451._12_4_ = 0x3fb8aa3b;
                auVar407 = vfmadd213ps_fma(auVar451,auVar415,auVar316);
                auVar465._0_4_ = (int)auVar407._0_4_;
                auVar465._4_4_ = (int)auVar407._4_4_;
                auVar465._8_4_ = (int)auVar407._8_4_;
                auVar465._12_4_ = (int)auVar407._12_4_;
                auVar332 = vcvtdq2ps_avx(auVar465);
                auVar407 = vcmpps_avx(auVar407,auVar332,1);
                auVar407 = vandps_avx(auVar407,auVar239);
                auVar407 = vsubps_avx(auVar332,auVar407);
                auVar432._8_4_ = 0x3f318000;
                auVar432._0_8_ = 0x3f3180003f318000;
                auVar432._12_4_ = 0x3f318000;
                auVar332 = vfmsub231ps_fma(auVar415,auVar407,auVar432);
                auVar443._8_4_ = 0xb95e8083;
                auVar443._0_8_ = 0xb95e8083b95e8083;
                auVar443._12_4_ = 0xb95e8083;
                auVar415 = vfnmsub231ps_fma(auVar332,auVar407,auVar443);
                auVar466._0_4_ = auVar415._0_4_ * auVar415._0_4_;
                auVar466._4_4_ = auVar415._4_4_ * auVar415._4_4_;
                auVar466._8_4_ = auVar415._8_4_ * auVar415._8_4_;
                auVar466._12_4_ = auVar415._12_4_ * auVar415._12_4_;
                auVar321._8_4_ = 0x39506967;
                auVar321._0_8_ = 0x3950696739506967;
                auVar321._12_4_ = 0x39506967;
                auVar332 = vfmadd213ps_fma(auVar321,auVar415,auVar457);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar244);
                auVar309._8_4_ = 0x3d2aa9c1;
                auVar309._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar309._12_4_ = 0x3d2aa9c1;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar309);
                auVar285._8_4_ = 0x3e2aaaaa;
                auVar285._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar285._12_4_ = 0x3e2aaaaa;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar285);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar316);
                auVar332 = vfmadd213ps_fma(auVar332,auVar466,auVar415);
                auVar174._0_4_ = auVar332._0_4_ + fVar62;
                auVar174._4_4_ = auVar332._4_4_ + fVar61;
                auVar174._8_4_ = auVar332._8_4_ + fVar2;
                auVar174._12_4_ = auVar332._12_4_ + fVar3;
                auVar120._0_4_ = (int)auVar407._0_4_;
                auVar120._4_4_ = (int)auVar407._4_4_;
                auVar120._8_4_ = (int)auVar407._8_4_;
                auVar120._12_4_ = (int)auVar407._12_4_;
                auVar407 = vpslld_avx(auVar120,0x17);
                auVar407 = vpaddd_avx(auVar407,auVar239);
                auVar63 = vfmadd213ps_fma(auVar407,auVar174,auVar239);
                auVar175._8_4_ = 0x800000;
                auVar175._0_8_ = 0x80000000800000;
                auVar175._12_4_ = 0x800000;
                auVar407 = vmaxps_avx(auVar63,auVar175);
                auVar332 = vpsrld_avx(auVar407,0x17);
                auVar286._8_4_ = 0xffffff82;
                auVar286._0_8_ = 0xffffff82ffffff82;
                auVar286._12_4_ = 0xffffff82;
                auVar332 = vpaddd_avx(auVar332,auVar286);
                auVar287._8_4_ = 0x807fffff;
                auVar287._0_8_ = 0x807fffff807fffff;
                auVar287._12_4_ = 0x807fffff;
                auVar407 = vandps_avx(auVar407,auVar287);
                auVar328 = vorps_avx(auVar407,auVar316);
                auVar415 = vcvtdq2ps_avx(auVar332);
                auVar288._8_4_ = 0x3f3504f3;
                auVar288._0_8_ = 0x3f3504f33f3504f3;
                auVar288._12_4_ = 0x3f3504f3;
                auVar332 = vcmpps_avx(auVar328,auVar288,1);
                auVar407 = vandps_avx(auVar332,auVar328);
                auVar176._0_4_ = auVar328._0_4_ + -1.0 + auVar407._0_4_;
                auVar176._4_4_ = auVar328._4_4_ + -1.0 + auVar407._4_4_;
                auVar176._8_4_ = auVar328._8_4_ + -1.0 + auVar407._8_4_;
                auVar176._12_4_ = auVar328._12_4_ + -1.0 + auVar407._12_4_;
                auVar407 = vandps_avx(auVar332,auVar239);
                auVar332 = vsubps_avx(auVar415,auVar407);
                auVar413._0_4_ = auVar176._0_4_ * auVar176._0_4_;
                auVar413._4_4_ = auVar176._4_4_ * auVar176._4_4_;
                auVar413._8_4_ = auVar176._8_4_ * auVar176._8_4_;
                auVar413._12_4_ = auVar176._12_4_ * auVar176._12_4_;
                auVar467._8_4_ = 0x3d9021bb;
                auVar467._0_8_ = 0x3d9021bb3d9021bb;
                auVar467._12_4_ = 0x3d9021bb;
                auVar387._8_4_ = 0xbdebd1b8;
                auVar387._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar387._12_4_ = 0xbdebd1b8;
                auVar407 = vfmadd213ps_fma(auVar467,auVar176,auVar387);
                auVar388._8_4_ = 0x3def251a;
                auVar388._0_8_ = 0x3def251a3def251a;
                auVar388._12_4_ = 0x3def251a;
                auVar407 = vfmadd213ps_fma(auVar407,auVar176,auVar388);
                auVar389._8_4_ = 0xbdfe5d4f;
                auVar389._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar389._12_4_ = 0xbdfe5d4f;
                auVar407 = vfmadd213ps_fma(auVar407,auVar176,auVar389);
                auVar390._8_4_ = 0x3e11e9bf;
                auVar390._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar390._12_4_ = 0x3e11e9bf;
                auVar407 = vfmadd213ps_fma(auVar407,auVar176,auVar390);
                auVar391._8_4_ = 0xbe2aae50;
                auVar391._0_8_ = 0xbe2aae50be2aae50;
                auVar391._12_4_ = 0xbe2aae50;
                auVar407 = vfmadd213ps_fma(auVar407,auVar176,auVar391);
                auVar392._8_4_ = 0x3e4cceac;
                auVar392._0_8_ = 0x3e4cceac3e4cceac;
                auVar392._12_4_ = 0x3e4cceac;
                auVar407 = vfmadd213ps_fma(auVar407,auVar176,auVar392);
                auVar393._8_4_ = 0xbe7ffffc;
                auVar393._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar393._12_4_ = 0xbe7ffffc;
                auVar407 = vfmadd213ps_fma(auVar407,auVar176,auVar393);
                auVar394._8_4_ = 0x3eaaaaaa;
                auVar394._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar394._12_4_ = 0x3eaaaaaa;
                auVar407 = vfmadd213ps_fma(auVar407,auVar176,auVar394);
                auVar395._0_4_ = auVar413._0_4_ * auVar176._0_4_ * auVar407._0_4_;
                auVar395._4_4_ = auVar413._4_4_ * auVar176._4_4_ * auVar407._4_4_;
                auVar395._8_4_ = auVar413._8_4_ * auVar176._8_4_ * auVar407._8_4_;
                auVar395._12_4_ = auVar413._12_4_ * auVar176._12_4_ * auVar407._12_4_;
                auVar407 = vfmadd231ps_fma(auVar395,auVar332,auVar443);
                auVar415 = vfmsub231ps_fma(auVar407,auVar316,auVar413);
                auVar25._12_4_ = 0;
                auVar25._0_12_ = ZEXT412(0);
                auVar327 = ZEXT1264(ZEXT412(0)) << 0x20;
                auVar407 = vcmpps_avx(auVar63,auVar25 << 0x20,2);
                auVar415 = vsubps_avx(auVar415,auVar176);
                auVar332 = vfnmadd231ps_fma(auVar415,auVar432,auVar332);
                auVar177._0_4_ = auVar332._0_4_ + auVar332._0_4_;
                auVar177._4_4_ = auVar332._4_4_ + auVar332._4_4_;
                auVar177._8_4_ = auVar332._8_4_ + auVar332._8_4_;
                auVar177._12_4_ = auVar332._12_4_ + auVar332._12_4_;
                auVar289._8_4_ = 0x7fffffff;
                auVar289._0_8_ = 0x7fffffff7fffffff;
                auVar289._12_4_ = 0x7fffffff;
                auVar407 = vblendvps_avx(auVar177,auVar289,auVar407);
                auVar178._8_4_ = 0x42b0c0a5;
                auVar178._0_8_ = 0x42b0c0a542b0c0a5;
                auVar178._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar407,auVar178);
                auVar179._8_4_ = 0xc2b0c0a5;
                auVar179._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar179._12_4_ = 0xc2b0c0a5;
                auVar415 = vmaxps_avx(auVar407,auVar179);
                auVar407 = vfmadd213ps_fma(auVar451,auVar415,auVar316);
                auVar290._0_4_ = (int)auVar407._0_4_;
                auVar290._4_4_ = (int)auVar407._4_4_;
                auVar290._8_4_ = (int)auVar407._8_4_;
                auVar290._12_4_ = (int)auVar407._12_4_;
                auVar332 = vcvtdq2ps_avx(auVar290);
                auVar407 = vcmpps_avx(auVar407,auVar332,1);
                auVar407 = vandps_avx(auVar407,auVar239);
                auVar407 = vsubps_avx(auVar332,auVar407);
                auVar332 = vfmsub231ps_fma(auVar415,auVar407,auVar432);
                auVar415 = vfnmsub231ps_fma(auVar332,auVar407,auVar443);
                auVar291._0_4_ = auVar415._0_4_ * auVar415._0_4_;
                auVar291._4_4_ = auVar415._4_4_ * auVar415._4_4_;
                auVar291._8_4_ = auVar415._8_4_ * auVar415._8_4_;
                auVar291._12_4_ = auVar415._12_4_ * auVar415._12_4_;
                auVar332 = vfmadd213ps_fma(auVar321,auVar415,auVar457);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar244);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar309);
                auVar319 = ZEXT1664(auVar239);
                auVar72._8_4_ = 0x3e2aaaaa;
                auVar72._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar72._12_4_ = 0x3e2aaaaa;
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar72);
                auVar332 = vfmadd213ps_fma(auVar332,auVar415,auVar316);
                auVar332 = vfmadd213ps_fma(auVar332,auVar291,auVar415);
                auVar121._0_4_ = auVar332._0_4_ + fVar62;
                auVar121._4_4_ = auVar332._4_4_ + fVar61;
                auVar121._8_4_ = auVar332._8_4_ + fVar2;
                auVar121._12_4_ = auVar332._12_4_ + fVar3;
                auVar180._0_4_ = (int)auVar407._0_4_;
                auVar180._4_4_ = (int)auVar407._4_4_;
                auVar180._8_4_ = (int)auVar407._8_4_;
                auVar180._12_4_ = (int)auVar407._12_4_;
                auVar407 = vpslld_avx(auVar180,0x17);
                auVar407 = vpaddd_avx(auVar407,auVar239);
                auVar407 = vfmadd213ps_fma(auVar407,auVar121,auVar239);
                auVar239 = vrcpps_avx(auVar407);
                auVar292._0_4_ = auVar239._0_4_ + auVar239._0_4_;
                auVar292._4_4_ = auVar239._4_4_ + auVar239._4_4_;
                auVar292._8_4_ = auVar239._8_4_ + auVar239._8_4_;
                auVar292._12_4_ = auVar239._12_4_ + auVar239._12_4_;
                auVar73._8_4_ = 0x40000000;
                auVar73._0_8_ = 0x4000000040000000;
                auVar73._12_4_ = 0x40000000;
                auVar407 = vfmsub213ps_fma(auVar407,auVar292,auVar73);
                auVar239 = vfnmadd213ps_fma(auVar407,auVar239,auVar292);
                auVar119 = vfmsub231ps_fma(auVar119,auVar119,auVar239);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar125._4_4_ = uVar1;
                auVar125._0_4_ = uVar1;
                auVar125._8_4_ = uVar1;
                auVar125._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar186._4_4_ = uVar1;
                auVar186._0_4_ = uVar1;
                auVar186._8_4_ = uVar1;
                auVar186._12_4_ = uVar1;
                auVar332 = vfmadd231ps_fma(auVar186,auVar119,auVar125);
                auVar407 = vmaxps_avx(auVar407,auVar332);
                auVar239 = vminps_avx(auVar407,auVar239);
                auVar119._0_4_ = auVar119._0_4_ * auVar239._0_4_;
                auVar119._4_4_ = fVar238 * auVar239._4_4_;
                auVar119._8_4_ = fVar486 * auVar239._8_4_;
                auVar119._12_4_ = fVar487 * auVar239._12_4_;
              }
              *pauVar43 = auVar119;
              pauVar43 = pauVar43 + 1;
              iVar50 = iVar50 + 4;
              bVar60 = iVar35 != iVar5;
              iVar35 = iVar35 + 1;
            } while (bVar60);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar30);
      }
      if ((bVar59 && bVar57) && iVar4 == 1) {
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        uVar47 = 0;
        auVar375 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar319 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar327 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (-1 < iVar5) {
            pauVar43 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar47 * top_blob->elemsize + (long)top_blob->data);
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar35 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar341 = ZEXT816(0) << 0x40;
              }
              else {
                auVar341 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var6) + uVar47 * 0x10);
              }
              auVar484 = ZEXT1664(auVar341);
              if (0 < iVar29) {
                pauVar55 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * uVar47 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var9 = pp_Var8[-3];
                puVar37 = (undefined4 *)
                          ((long)(_func_int ***)local_a8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar35) * 4);
                uVar45 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var9)) {
                    puVar36 = puVar37;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      uVar1 = *puVar36;
                      auVar126._4_4_ = uVar1;
                      auVar126._0_4_ = uVar1;
                      auVar126._8_4_ = uVar1;
                      auVar126._12_4_ = uVar1;
                      auVar239 = vfmadd231ps_fma(auVar484._0_16_,auVar126,*pauVar55);
                      auVar484 = ZEXT1664(auVar239);
                      pauVar55 = pauVar55 + 1;
                      puVar36 = puVar36 + *(int *)(&this->field_0xd8 + (long)p_Var9);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  auVar341 = auVar484._0_16_;
                  uVar45 = uVar45 + 1;
                  puVar37 = (undefined4 *)((long)puVar37 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar45 != uVar52);
              }
              auVar332 = auVar375._0_16_;
              auVar407 = auVar327._0_16_;
              auVar239 = auVar319._0_16_;
              fVar62 = auVar327._0_4_;
              fVar61 = auVar327._4_4_;
              fVar2 = auVar327._8_4_;
              fVar3 = auVar327._12_4_;
              fVar238 = auVar341._4_4_;
              fVar486 = auVar341._8_4_;
              fVar487 = auVar341._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar341 = vmaxps_avx(auVar341,auVar332);
                break;
              case 2:
                auVar239 = vmaxps_avx(auVar341,auVar332);
                auVar407 = vminps_avx(auVar341,auVar332);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar344._4_4_ = uVar1;
                auVar344._0_4_ = uVar1;
                auVar344._8_4_ = uVar1;
                auVar344._12_4_ = uVar1;
                auVar341 = vfmadd213ps_fma(auVar344,auVar407,auVar239);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar129._4_4_ = uVar1;
                auVar129._0_4_ = uVar1;
                auVar129._8_4_ = uVar1;
                auVar129._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar474._4_4_ = uVar1;
                auVar474._0_4_ = uVar1;
                auVar474._8_4_ = uVar1;
                auVar474._12_4_ = uVar1;
                auVar239 = vmaxps_avx(auVar341,auVar129);
                auVar341 = vminps_avx(auVar474,auVar239);
                break;
              case 4:
                auVar130._0_8_ = auVar341._0_8_ ^ 0x8000000080000000;
                auVar130._8_4_ = -fVar486;
                auVar130._12_4_ = -fVar487;
                auVar194._8_4_ = 0x42b0c0a5;
                auVar194._0_8_ = 0x42b0c0a542b0c0a5;
                auVar194._12_4_ = 0x42b0c0a5;
                auVar332 = vminps_avx(auVar130,auVar194);
                auVar195._8_4_ = 0xc2b0c0a5;
                auVar195._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar195._12_4_ = 0xc2b0c0a5;
                auVar328 = vmaxps_avx(auVar332,auVar195);
                auVar342._8_4_ = 0x3fb8aa3b;
                auVar342._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar342._12_4_ = 0x3fb8aa3b;
                auVar332 = vfmadd213ps_fma(auVar342,auVar328,auVar239);
                auVar475._0_4_ = (int)auVar332._0_4_;
                auVar475._4_4_ = (int)auVar332._4_4_;
                auVar475._8_4_ = (int)auVar332._8_4_;
                auVar475._12_4_ = (int)auVar332._12_4_;
                auVar415 = vcvtdq2ps_avx(auVar475);
                auVar332 = vcmpps_avx(auVar332,auVar415,1);
                auVar332 = vandps_avx(auVar332,auVar407);
                auVar332 = vsubps_avx(auVar415,auVar332);
                auVar78._8_4_ = 0x3f318000;
                auVar78._0_8_ = 0x3f3180003f318000;
                auVar78._12_4_ = 0x3f318000;
                auVar415 = vfmsub231ps_fma(auVar328,auVar332,auVar78);
                auVar196._8_4_ = 0x395e8083;
                auVar196._0_8_ = 0x395e8083395e8083;
                auVar196._12_4_ = 0x395e8083;
                auVar328 = vfmsub231ps_fma(auVar415,auVar332,auVar196);
                auVar476._0_4_ = auVar328._0_4_ * auVar328._0_4_;
                auVar476._4_4_ = auVar328._4_4_ * auVar328._4_4_;
                auVar476._8_4_ = auVar328._8_4_ * auVar328._8_4_;
                auVar476._12_4_ = auVar328._12_4_ * auVar328._12_4_;
                auVar417._8_4_ = 0x39506967;
                auVar417._0_8_ = 0x3950696739506967;
                auVar417._12_4_ = 0x39506967;
                auVar197._8_4_ = 0x3ab743ce;
                auVar197._0_8_ = 0x3ab743ce3ab743ce;
                auVar197._12_4_ = 0x3ab743ce;
                auVar415 = vfmadd213ps_fma(auVar417,auVar328,auVar197);
                auVar198._8_4_ = 0x3c088908;
                auVar198._0_8_ = 0x3c0889083c088908;
                auVar198._12_4_ = 0x3c088908;
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar198);
                auVar79._8_4_ = 0x3d2aa9c1;
                auVar79._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar79._12_4_ = 0x3d2aa9c1;
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar79);
                auVar80._8_4_ = 0x3e2aaaaa;
                auVar80._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar80._12_4_ = 0x3e2aaaaa;
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar80);
                auVar239 = vfmadd213ps_fma(auVar415,auVar328,auVar239);
                auVar239 = vfmadd213ps_fma(auVar239,auVar476,auVar328);
                auVar131._0_4_ = auVar239._0_4_ + fVar62;
                auVar131._4_4_ = auVar239._4_4_ + fVar61;
                auVar131._8_4_ = auVar239._8_4_ + fVar2;
                auVar131._12_4_ = auVar239._12_4_ + fVar3;
                auVar375 = ZEXT864(0) << 0x20;
                auVar343._0_4_ = (int)auVar332._0_4_;
                auVar343._4_4_ = (int)auVar332._4_4_;
                auVar343._8_4_ = (int)auVar332._8_4_;
                auVar343._12_4_ = (int)auVar332._12_4_;
                auVar239 = vpslld_avx(auVar343,0x17);
                auVar239 = vpaddd_avx(auVar239,auVar407);
                auVar332 = vfmadd213ps_fma(auVar239,auVar131,auVar407);
                auVar239 = vrcpps_avx(auVar332);
                auVar407 = vfmsub213ps_fma(auVar332,auVar239,auVar407);
                auVar341 = vfnmadd132ps_fma(auVar407,auVar239,auVar239);
                break;
              case 5:
                auVar433._8_4_ = 0x42b0c0a5;
                auVar433._0_8_ = 0x42b0c0a542b0c0a5;
                auVar433._12_4_ = 0x42b0c0a5;
                auVar332 = vminps_avx(auVar341,auVar433);
                auVar444._8_4_ = 0xc2b0c0a5;
                auVar444._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar444._12_4_ = 0xc2b0c0a5;
                auVar328 = vmaxps_avx(auVar444,auVar332);
                auVar452._8_4_ = 0x3fb8aa3b;
                auVar452._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar452._12_4_ = 0x3fb8aa3b;
                auVar332 = vfmadd213ps_fma(auVar452,auVar328,auVar239);
                auVar471._0_4_ = (int)auVar332._0_4_;
                auVar471._4_4_ = (int)auVar332._4_4_;
                auVar471._8_4_ = (int)auVar332._8_4_;
                auVar471._12_4_ = (int)auVar332._12_4_;
                auVar415 = vcvtdq2ps_avx(auVar471);
                auVar332 = vcmpps_avx(auVar332,auVar415,1);
                auVar332 = vandps_avx(auVar332,auVar407);
                auVar332 = vsubps_avx(auVar415,auVar332);
                auVar434._8_4_ = 0x3f318000;
                auVar434._0_8_ = 0x3f3180003f318000;
                auVar434._12_4_ = 0x3f318000;
                auVar415 = vfmsub231ps_fma(auVar328,auVar332,auVar434);
                auVar445._8_4_ = 0xb95e8083;
                auVar445._0_8_ = 0xb95e8083b95e8083;
                auVar445._12_4_ = 0xb95e8083;
                auVar328 = vfnmsub231ps_fma(auVar415,auVar332,auVar445);
                auVar472._0_4_ = auVar328._0_4_ * auVar328._0_4_;
                auVar472._4_4_ = auVar328._4_4_ * auVar328._4_4_;
                auVar472._8_4_ = auVar328._8_4_ * auVar328._8_4_;
                auVar472._12_4_ = auVar328._12_4_ * auVar328._12_4_;
                auVar458._8_4_ = 0x39506967;
                auVar458._0_8_ = 0x3950696739506967;
                auVar458._12_4_ = 0x39506967;
                auVar245._8_4_ = 0x3ab743ce;
                auVar245._0_8_ = 0x3ab743ce3ab743ce;
                auVar245._12_4_ = 0x3ab743ce;
                auVar415 = vfmadd213ps_fma(auVar458,auVar328,auVar245);
                auVar322._8_4_ = 0x3c088908;
                auVar322._0_8_ = 0x3c0889083c088908;
                auVar322._12_4_ = 0x3c088908;
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar322);
                auVar310._8_4_ = 0x3d2aa9c1;
                auVar310._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar310._12_4_ = 0x3d2aa9c1;
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar310);
                auVar323._8_4_ = 0x3e2aaaaa;
                auVar323._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar323._12_4_ = 0x3e2aaaaa;
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar323);
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar239);
                auVar415 = vfmadd213ps_fma(auVar415,auVar472,auVar328);
                auVar187._0_4_ = auVar415._0_4_ + fVar62;
                auVar187._4_4_ = auVar415._4_4_ + fVar61;
                auVar187._8_4_ = auVar415._8_4_ + fVar2;
                auVar187._12_4_ = auVar415._12_4_ + fVar3;
                auVar127._0_4_ = (int)auVar332._0_4_;
                auVar127._4_4_ = (int)auVar332._4_4_;
                auVar127._8_4_ = (int)auVar332._8_4_;
                auVar127._12_4_ = (int)auVar332._12_4_;
                auVar332 = vpslld_avx(auVar127,0x17);
                auVar332 = vpaddd_avx(auVar332,auVar407);
                auVar106 = vfmadd213ps_fma(auVar332,auVar187,auVar407);
                auVar188._8_4_ = 0x800000;
                auVar188._0_8_ = 0x80000000800000;
                auVar188._12_4_ = 0x800000;
                auVar332 = vmaxps_avx(auVar106,auVar188);
                auVar415 = vpsrld_avx(auVar332,0x17);
                auVar293._8_4_ = 0xffffff82;
                auVar293._0_8_ = 0xffffff82ffffff82;
                auVar293._12_4_ = 0xffffff82;
                auVar415 = vpaddd_avx(auVar415,auVar293);
                auVar294._8_4_ = 0x807fffff;
                auVar294._0_8_ = 0x807fffff807fffff;
                auVar294._12_4_ = 0x807fffff;
                auVar332 = vandps_avx(auVar332,auVar294);
                auVar63 = vorps_avx(auVar332,auVar239);
                auVar328 = vcvtdq2ps_avx(auVar415);
                auVar295._8_4_ = 0x3f3504f3;
                auVar295._0_8_ = 0x3f3504f33f3504f3;
                auVar295._12_4_ = 0x3f3504f3;
                auVar415 = vcmpps_avx(auVar63,auVar295,1);
                auVar332 = vandps_avx(auVar415,auVar63);
                auVar189._0_4_ = auVar63._0_4_ + -1.0 + auVar332._0_4_;
                auVar189._4_4_ = auVar63._4_4_ + -1.0 + auVar332._4_4_;
                auVar189._8_4_ = auVar63._8_4_ + -1.0 + auVar332._8_4_;
                auVar189._12_4_ = auVar63._12_4_ + -1.0 + auVar332._12_4_;
                auVar332 = vandps_avx(auVar415,auVar407);
                auVar415 = vsubps_avx(auVar328,auVar332);
                auVar416._0_4_ = auVar189._0_4_ * auVar189._0_4_;
                auVar416._4_4_ = auVar189._4_4_ * auVar189._4_4_;
                auVar416._8_4_ = auVar189._8_4_ * auVar189._8_4_;
                auVar416._12_4_ = auVar189._12_4_ * auVar189._12_4_;
                auVar473._8_4_ = 0x3d9021bb;
                auVar473._0_8_ = 0x3d9021bb3d9021bb;
                auVar473._12_4_ = 0x3d9021bb;
                auVar396._8_4_ = 0xbdebd1b8;
                auVar396._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar396._12_4_ = 0xbdebd1b8;
                auVar332 = vfmadd213ps_fma(auVar473,auVar189,auVar396);
                auVar397._8_4_ = 0x3def251a;
                auVar397._0_8_ = 0x3def251a3def251a;
                auVar397._12_4_ = 0x3def251a;
                auVar332 = vfmadd213ps_fma(auVar332,auVar189,auVar397);
                auVar398._8_4_ = 0xbdfe5d4f;
                auVar398._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar398._12_4_ = 0xbdfe5d4f;
                auVar332 = vfmadd213ps_fma(auVar332,auVar189,auVar398);
                auVar399._8_4_ = 0x3e11e9bf;
                auVar399._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar399._12_4_ = 0x3e11e9bf;
                auVar332 = vfmadd213ps_fma(auVar332,auVar189,auVar399);
                auVar400._8_4_ = 0xbe2aae50;
                auVar400._0_8_ = 0xbe2aae50be2aae50;
                auVar400._12_4_ = 0xbe2aae50;
                auVar332 = vfmadd213ps_fma(auVar332,auVar189,auVar400);
                auVar401._8_4_ = 0x3e4cceac;
                auVar401._0_8_ = 0x3e4cceac3e4cceac;
                auVar401._12_4_ = 0x3e4cceac;
                auVar332 = vfmadd213ps_fma(auVar332,auVar189,auVar401);
                auVar402._8_4_ = 0xbe7ffffc;
                auVar402._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar402._12_4_ = 0xbe7ffffc;
                auVar332 = vfmadd213ps_fma(auVar332,auVar189,auVar402);
                auVar403._8_4_ = 0x3eaaaaaa;
                auVar403._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar403._12_4_ = 0x3eaaaaaa;
                auVar332 = vfmadd213ps_fma(auVar332,auVar189,auVar403);
                auVar404._0_4_ = auVar416._0_4_ * auVar189._0_4_ * auVar332._0_4_;
                auVar404._4_4_ = auVar416._4_4_ * auVar189._4_4_ * auVar332._4_4_;
                auVar404._8_4_ = auVar416._8_4_ * auVar189._8_4_ * auVar332._8_4_;
                auVar404._12_4_ = auVar416._12_4_ * auVar189._12_4_ * auVar332._12_4_;
                auVar332 = vfmadd231ps_fma(auVar404,auVar415,auVar445);
                auVar328 = vfmsub231ps_fma(auVar332,auVar239,auVar416);
                auVar26._12_4_ = 0;
                auVar26._0_12_ = ZEXT412(0);
                auVar375 = ZEXT1264(ZEXT412(0)) << 0x20;
                auVar332 = vcmpps_avx(auVar106,auVar26 << 0x20,2);
                auVar328 = vsubps_avx(auVar328,auVar189);
                auVar415 = vfnmadd231ps_fma(auVar328,auVar434,auVar415);
                auVar190._0_4_ = auVar415._0_4_ + auVar415._0_4_;
                auVar190._4_4_ = auVar415._4_4_ + auVar415._4_4_;
                auVar190._8_4_ = auVar415._8_4_ + auVar415._8_4_;
                auVar190._12_4_ = auVar415._12_4_ + auVar415._12_4_;
                auVar296._8_4_ = 0x7fffffff;
                auVar296._0_8_ = 0x7fffffff7fffffff;
                auVar296._12_4_ = 0x7fffffff;
                auVar332 = vblendvps_avx(auVar190,auVar296,auVar332);
                auVar191._8_4_ = 0x42b0c0a5;
                auVar191._0_8_ = 0x42b0c0a542b0c0a5;
                auVar191._12_4_ = 0x42b0c0a5;
                auVar332 = vminps_avx(auVar332,auVar191);
                auVar192._8_4_ = 0xc2b0c0a5;
                auVar192._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar192._12_4_ = 0xc2b0c0a5;
                auVar328 = vmaxps_avx(auVar332,auVar192);
                auVar332 = vfmadd213ps_fma(auVar452,auVar328,auVar239);
                auVar297._0_4_ = (int)auVar332._0_4_;
                auVar297._4_4_ = (int)auVar332._4_4_;
                auVar297._8_4_ = (int)auVar332._8_4_;
                auVar297._12_4_ = (int)auVar332._12_4_;
                auVar415 = vcvtdq2ps_avx(auVar297);
                auVar332 = vcmpps_avx(auVar332,auVar415,1);
                auVar332 = vandps_avx(auVar332,auVar407);
                auVar332 = vsubps_avx(auVar415,auVar332);
                auVar415 = vfmsub231ps_fma(auVar328,auVar332,auVar434);
                auVar328 = vfnmsub231ps_fma(auVar415,auVar332,auVar445);
                auVar298._0_4_ = auVar328._0_4_ * auVar328._0_4_;
                auVar298._4_4_ = auVar328._4_4_ * auVar328._4_4_;
                auVar298._8_4_ = auVar328._8_4_ * auVar328._8_4_;
                auVar298._12_4_ = auVar328._12_4_ * auVar328._12_4_;
                auVar415 = vfmadd213ps_fma(auVar458,auVar328,auVar245);
                auVar319 = ZEXT1664(auVar239);
                auVar317._8_4_ = 0x3c088908;
                auVar317._0_8_ = 0x3c0889083c088908;
                auVar317._12_4_ = 0x3c088908;
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar317);
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar310);
                auVar327 = ZEXT1664(auVar407);
                auVar415 = vfmadd213ps_fma(auVar415,auVar328,auVar323);
                auVar239 = vfmadd213ps_fma(auVar415,auVar328,auVar239);
                auVar239 = vfmadd213ps_fma(auVar239,auVar298,auVar328);
                auVar128._0_4_ = auVar239._0_4_ + fVar62;
                auVar128._4_4_ = auVar239._4_4_ + fVar61;
                auVar128._8_4_ = auVar239._8_4_ + fVar2;
                auVar128._12_4_ = auVar239._12_4_ + fVar3;
                auVar193._0_4_ = (int)auVar332._0_4_;
                auVar193._4_4_ = (int)auVar332._4_4_;
                auVar193._8_4_ = (int)auVar332._8_4_;
                auVar193._12_4_ = (int)auVar332._12_4_;
                auVar239 = vpslld_avx(auVar193,0x17);
                auVar239 = vpaddd_avx(auVar239,auVar407);
                auVar407 = vfmadd213ps_fma(auVar239,auVar128,auVar407);
                auVar239 = vrcpps_avx(auVar407);
                auVar299._0_4_ = auVar239._0_4_ + auVar239._0_4_;
                auVar299._4_4_ = auVar239._4_4_ + auVar239._4_4_;
                auVar299._8_4_ = auVar239._8_4_ + auVar239._8_4_;
                auVar299._12_4_ = auVar239._12_4_ + auVar239._12_4_;
                auVar77._8_4_ = 0x40000000;
                auVar77._0_8_ = 0x4000000040000000;
                auVar77._12_4_ = 0x40000000;
                auVar407 = vfmsub213ps_fma(auVar407,auVar299,auVar77);
                auVar239 = vfnmadd213ps_fma(auVar407,auVar239,auVar299);
                auVar341 = vfmsub231ps_fma(auVar341,auVar341,auVar239);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar132._4_4_ = uVar1;
                auVar132._0_4_ = uVar1;
                auVar132._8_4_ = uVar1;
                auVar132._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar199._4_4_ = uVar1;
                auVar199._0_4_ = uVar1;
                auVar199._8_4_ = uVar1;
                auVar199._12_4_ = uVar1;
                auVar239 = vfmadd231ps_fma(auVar199,auVar341,auVar132);
                auVar239 = vmaxps_avx(auVar332,auVar239);
                auVar239 = vminps_avx(auVar239,auVar407);
                auVar341._0_4_ = auVar341._0_4_ * auVar239._0_4_;
                auVar341._4_4_ = fVar238 * auVar239._4_4_;
                auVar341._8_4_ = fVar486 * auVar239._8_4_;
                auVar341._12_4_ = fVar487 * auVar239._12_4_;
              }
              *pauVar43 = auVar341;
              pauVar43 = pauVar43 + 1;
              bVar57 = iVar35 != iVar5;
              iVar35 = iVar35 + 1;
            } while (bVar57);
          }
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar30);
      }
      if (iVar4 == 4 && (bVar56 && bVar58)) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        local_50 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_58 = (this->weight_data_packed).data;
        local_38 = (ulong)uVar30;
        local_100 = 0;
        do {
          pvVar28 = local_40;
          pvVar10 = local_a8.data;
          if (-1 < iVar5) {
            lVar51 = local_48 * local_100;
            pfVar31 = (float *)(local_50 * local_100 + (long)local_58);
            lVar53 = (long)local_a8.w * local_a8.elemsize;
            pp_Var8 = this->_vptr_Convolution1D_x86_fma;
            iVar35 = 0;
            uVar47 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar319 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                            local_100 * 4));
              }
              auVar239 = auVar319._0_16_;
              if (0 < iVar29) {
                p_Var9 = pp_Var8[-3];
                pfVar38 = (float *)((long)(_func_int ***)pvVar10 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar35) * 4);
                uVar45 = 0;
                pfVar44 = pfVar31;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var9)) {
                    pfVar49 = pfVar38;
                    iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                    do {
                      auVar81._0_4_ = *pfVar44 * *pfVar49;
                      auVar81._4_4_ = pfVar44[1] * pfVar49[1];
                      auVar81._8_4_ = pfVar44[2] * pfVar49[2];
                      auVar81._12_4_ = pfVar44[3] * pfVar49[3];
                      auVar239 = vshufpd_avx(auVar81,auVar81,1);
                      auVar82._0_4_ = auVar239._0_4_ + auVar81._0_4_;
                      auVar82._4_4_ = auVar239._4_4_ + auVar81._4_4_;
                      auVar82._8_4_ = auVar239._8_4_ + auVar81._8_4_;
                      auVar82._12_4_ = auVar239._12_4_ + auVar81._12_4_;
                      auVar239 = vmovshdup_avx(auVar82);
                      auVar319 = ZEXT464((uint)(auVar239._0_4_ + auVar319._0_4_ + auVar82._0_4_));
                      pfVar44 = pfVar44 + 4;
                      pfVar49 = pfVar49 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 2);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  auVar239 = auVar319._0_16_;
                  uVar45 = uVar45 + 1;
                  pfVar38 = (float *)((long)pfVar38 + lVar53);
                } while (uVar45 != uVar52);
              }
              fVar61 = auVar239._0_4_;
              fVar62 = fVar61;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar239 = vmaxss_avx(auVar239,ZEXT416(0));
                fVar62 = auVar239._0_4_;
                break;
              case 2:
                auVar239 = vcmpss_avx(ZEXT816(0) << 0x40,auVar239,1);
                auVar201._8_4_ = 0x3f800000;
                auVar201._0_8_ = 0x3f8000003f800000;
                auVar201._12_4_ = 0x3f800000;
                auVar239 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)),
                                         auVar201,auVar239);
                fVar62 = auVar239._0_4_ * fVar61;
                break;
              case 3:
                fVar61 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar239 = vmaxss_avx(auVar239,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)
                                                      ));
                fVar62 = auVar239._0_4_;
                if (fVar61 < auVar239._0_4_) {
                  fVar62 = fVar61;
                }
                break;
              case 4:
                auVar239 = vminss_avx(auVar239,ZEXT416(0x42b0c0a5));
                auVar133._0_8_ = auVar239._0_8_ ^ 0x8000000080000000;
                auVar133._8_4_ = auVar239._8_4_ ^ 0x80000000;
                auVar133._12_4_ = auVar239._12_4_ ^ 0x80000000;
                auVar239 = vcmpss_avx(auVar239,ZEXT416(0xc2b0c0a5),1);
                auVar200._8_4_ = 0x42b0c0a5;
                auVar200._0_8_ = 0x42b0c0a542b0c0a5;
                auVar200._12_4_ = 0x42b0c0a5;
                auVar239 = vblendvps_avx(auVar133,auVar200,auVar239);
                fVar62 = expf(auVar239._0_4_);
                fVar62 = 1.0 / (fVar62 + 1.0);
                break;
              case 5:
                fVar62 = expf(fVar61);
                fVar62 = logf(fVar62 + 1.0);
                fVar62 = tanhf(fVar62);
                fVar62 = fVar62 * fVar61;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                fVar3 = (*(float **)(&this->field_0xf8 + (long)p_Var6))[1];
                fVar238 = -fVar3 / fVar2;
                fVar62 = 0.0;
                if ((fVar238 <= fVar61) && (fVar62 = fVar61, fVar61 <= fVar238 + 1.0 / fVar2)) {
                  auVar239 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar239,ZEXT416((uint)fVar3));
                  fVar62 = auVar239._0_4_ * fVar61;
                }
              }
              *(float *)((long)pvVar28 + uVar47 * 4 + lVar51) = fVar62;
              uVar47 = uVar47 + 1;
              iVar35 = iVar35 + 4;
            } while (uVar47 != _w);
          }
          local_100 = local_100 + 1;
        } while (local_100 != local_38);
      }
      if ((bVar56 && bVar58) && iVar4 == 1) {
        pvVar10 = top_blob->data;
        iVar4 = top_blob->w;
        sVar11 = top_blob->elemsize;
        pp_Var7 = this->_vptr_Convolution1D_x86_fma;
        uVar47 = 0;
        do {
          pvVar28 = local_a8.data;
          if (-1 < iVar5) {
            lVar51 = (long)local_a8.w * local_a8.elemsize;
            uVar45 = 0;
            do {
              p_Var6 = pp_Var7[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar319 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                            uVar47 * 4));
              }
              auVar239 = auVar319._0_16_;
              if (0 < iVar29) {
                iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                puVar34 = (uint *)((long)((int)uVar47 * iVar29 * iVar35) * 4 +
                                  *(long *)(&this->field_0x148 + (long)p_Var6));
                puVar39 = (uint *)((long)(_func_int ***)pvVar28 +
                                  (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * (int)uVar45) *
                                  4);
                uVar40 = 0;
                do {
                  if (0 < iVar35) {
                    puVar46 = puVar39;
                    iVar50 = iVar35;
                    do {
                      auVar239 = vfmadd231ss_fma(auVar319._0_16_,ZEXT416(*puVar34),ZEXT416(*puVar46)
                                                );
                      auVar319 = ZEXT1664(auVar239);
                      puVar34 = puVar34 + 1;
                      puVar46 = puVar46 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                      iVar50 = iVar50 + -1;
                    } while (iVar50 != 0);
                  }
                  auVar239 = auVar319._0_16_;
                  uVar40 = uVar40 + 1;
                  puVar39 = (uint *)((long)puVar39 + lVar51);
                } while (uVar40 != uVar52);
              }
              fVar61 = auVar239._0_4_;
              fVar62 = fVar61;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar239 = vmaxss_avx(auVar239,ZEXT416(0));
                fVar62 = auVar239._0_4_;
                break;
              case 2:
                auVar239 = vcmpss_avx(ZEXT816(0) << 0x40,auVar239,1);
                auVar203._8_4_ = 0x3f800000;
                auVar203._0_8_ = 0x3f8000003f800000;
                auVar203._12_4_ = 0x3f800000;
                auVar239 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)),
                                         auVar203,auVar239);
                fVar62 = auVar239._0_4_ * fVar61;
                break;
              case 3:
                fVar61 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar239 = vmaxss_avx(auVar239,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)
                                                      ));
                fVar62 = auVar239._0_4_;
                if (fVar61 < auVar239._0_4_) {
                  fVar62 = fVar61;
                }
                break;
              case 4:
                auVar239 = vminss_avx(auVar239,ZEXT416(0x42b0c0a5));
                auVar134._0_8_ = auVar239._0_8_ ^ 0x8000000080000000;
                auVar134._8_4_ = auVar239._8_4_ ^ 0x80000000;
                auVar134._12_4_ = auVar239._12_4_ ^ 0x80000000;
                auVar239 = vcmpss_avx(auVar239,ZEXT416(0xc2b0c0a5),1);
                auVar202._8_4_ = 0x42b0c0a5;
                auVar202._0_8_ = 0x42b0c0a542b0c0a5;
                auVar202._12_4_ = 0x42b0c0a5;
                auVar239 = vblendvps_avx(auVar134,auVar202,auVar239);
                fVar62 = expf(auVar239._0_4_);
                fVar62 = 1.0 / (fVar62 + 1.0);
                break;
              case 5:
                fVar62 = expf(fVar61);
                fVar62 = logf(fVar62 + 1.0);
                fVar62 = tanhf(fVar62);
                fVar62 = fVar62 * fVar61;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                fVar3 = (*(float **)(&this->field_0xf8 + (long)p_Var6))[1];
                fVar238 = -fVar3 / fVar2;
                fVar62 = 0.0;
                if ((fVar238 <= fVar61) && (fVar62 = fVar61, fVar61 <= fVar238 + 1.0 / fVar2)) {
                  auVar239 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar239,ZEXT416((uint)fVar3));
                  fVar62 = auVar239._0_4_ * fVar61;
                }
              }
              *(float *)((long)pvVar10 + uVar45 * 4 + (long)iVar4 * sVar11 * uVar47) = fVar62;
              uVar45 = uVar45 + 1;
            } while (uVar45 != _w);
          }
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar30);
      }
      iVar50 = 0;
    }
  }
  piVar27 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar50;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}